

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::SampleLd
          (VolPathIntegrator *this,Interaction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,SampledSpectrum *T_hat,SampledSpectrum *pathPDF)

{
  Vector3f *pVVar1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar2;
  Transform *this_00;
  int *piVar3;
  DenselySampledSpectrum *pDVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  Vector3f wiRender;
  Vector3f wi_00;
  Vector3f wi_01;
  ulong uVar16;
  Tuple3<pbrt::Vector3,_float> woRender;
  Tuple3<pbrt::Vector3,_float> woRender_00;
  Tuple3<pbrt::Vector3,_float> wo;
  Tuple3<pbrt::Vector3,_float> wo_00;
  ulong uVar17;
  Point3fi *pPVar18;
  Point3fi *pPVar19;
  SampledSpectrum *pSVar20;
  Float FVar21;
  MediumHandle MVar22;
  MediumHandle MVar23;
  bool bVar24;
  int iVar25;
  SurfaceInteraction *pSVar26;
  SampledLight *pSVar27;
  LightLiSample *pLVar28;
  MediumInteraction *pMVar29;
  uint64_t sequenceIndex;
  uint64_t seed;
  ShapeIntersection *pSVar30;
  int iVar31;
  DenselySampledSpectrum *pDVar32;
  float *pfVar33;
  int iVar34;
  DenselySampledSpectrum *this_01;
  float *pfVar35;
  int iVar36;
  int iVar37;
  optional<pbrt::ShapeIntersection> *w;
  ulong uVar38;
  pbrt *this_02;
  float *pfVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  int *piVar43;
  int *piVar44;
  Float *pFVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  Float FVar50;
  type tVar51;
  float fVar52;
  Float FVar53;
  Point2f PVar54;
  undefined8 uVar150;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined8 uVar151;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar152 [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar60 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar61 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar149 [64];
  undefined1 auVar259 [12];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar248 [60];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar258 [64];
  float fVar260;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar267;
  undefined1 auVar272 [12];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar271 [64];
  float fVar273;
  undefined1 auVar278 [12];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar277 [64];
  Vector3<float> VVar279;
  Point3f PVar280;
  Vector3<float> VVar281;
  Point3f p;
  Point3<float> PVar282;
  SampledSpectrum SVar283;
  SampledSpectrum SVar284;
  undefined1 local_658 [16];
  float local_640;
  Float tMax;
  undefined1 local_638 [16];
  Float tMin;
  int voxel [3];
  Float nextCrossingT [3];
  undefined1 local_600 [12];
  float fStack_5f4;
  undefined8 uStack_5f0;
  RNG *local_5e8;
  MediumHandle local_5e0;
  SampledSpectrum d;
  SampledSpectrum TmajAccum;
  Tuple3<pbrt::Point3,_float> local_590;
  SampledSpectrum Tmaj_1;
  undefined1 local_568 [8];
  undefined8 uStack_560;
  Ray local_558;
  SampledSpectrum sigma_maj;
  int voxelLimit [3];
  int step [3];
  Float deltaT [3];
  Vector3f wi;
  SampledSpectrum sigma_a;
  undefined1 local_4b8 [28];
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  float local_480;
  MediumInterface *local_478;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_470;
  TaggedPointer<pbrt::HGPhaseFunction> local_468;
  undefined1 local_460 [24];
  float afStack_448 [2];
  SampledSpectrum local_440;
  SampledSpectrum local_430;
  SampledSpectrum local_420;
  SampledSpectrum sigma_a_3;
  RNG rng;
  SampledSpectrum sigma_s;
  SampledSpectrum lightPathPDF;
  SampledSpectrum T_ray;
  Ray local_398;
  SampledSpectrum *local_368;
  SampledSpectrum local_360;
  float local_34c;
  SampledSpectrum uniPathPDF;
  Ray lightRay;
  undefined1 local_2f8 [16];
  Interval IStack_2e8;
  Tuple3<pbrt::Normal3,_float> TStack_2e0;
  float fStack_2d4;
  float fStack_2d0;
  float local_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  SampledSpectrum local_288;
  SampledSpectrum *local_270;
  SampledSpectrum sigma_t;
  optional<pbrt::SampledLight> sampledLight;
  ulong uStack_200;
  optional<pbrt::ShapeIntersection> si;
  SampledSpectrum Tmaj;
  optional<pbrt::LightLiSample> ls;
  undefined1 extraout_var [60];
  undefined1 auVar198 [64];
  undefined1 auVar195 [64];
  undefined1 auVar249 [56];
  float fVar257;
  
  auVar49 = in_ZMM7._0_16_;
  auVar252 = in_ZMM6._0_16_;
  auVar48 = in_ZMM4._0_16_;
  if (bsdf == (BSDF *)0x0) {
    IStack_2e8 = (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 z;
    local_2f8._0_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    local_2f8._4_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    local_2f8._8_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    local_2f8._12_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    si.optionalValue._0_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    si.optionalValue._4_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    si.optionalValue._8_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    si.optionalValue._12_4_ =
         (intr->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    si.optionalValue._24_8_ = 0;
    si.optionalValue._40_4_ = 0;
    si.optionalValue._44_4_ = 0;
    si.optionalValue._32_4_ = 0;
    si.optionalValue._36_4_ = 0;
    fStack_2d0 = 0.0;
    local_2cc = 0.0;
    TStack_2e0.x = 0.0;
    TStack_2e0.y = 0.0;
    fStack_2d4 = 0.0;
    TStack_2e0.z = (float)si.optionalValue._32_4_;
    si.optionalValue._16_8_ = IStack_2e8;
  }
  else {
    pSVar26 = Interaction::AsSurface(intr);
    pPVar18 = &(pSVar26->super_Interaction).pi;
    pPVar19 = &(pSVar26->super_Interaction).pi;
    local_2f8._0_4_ =
         (pPVar18->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    local_2f8._4_4_ =
         (pPVar18->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    local_2f8._8_4_ =
         (pPVar19->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    local_2f8._12_4_ =
         (pPVar19->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    pPVar18 = &(pSVar26->super_Interaction).pi;
    pPVar19 = &(pSVar26->super_Interaction).pi;
    si.optionalValue._0_4_ =
         (pPVar18->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    si.optionalValue._4_4_ =
         (pPVar18->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    si.optionalValue._8_4_ =
         (pPVar19->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    si.optionalValue._12_4_ =
         (pPVar19->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    IStack_2e8 = (pSVar26->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    TStack_2e0.z = (pSVar26->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    TStack_2e0.x = (pSVar26->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    TStack_2e0.y = (pSVar26->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_2cc = (pSVar26->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    uVar9 = (pSVar26->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar10 = (pSVar26->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar152 = ZEXT856((ulong)(pSVar26->super_Interaction).pi.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
    fStack_2d4 = (float)uVar9;
    fStack_2d0 = (float)uVar10;
    si.optionalValue._16_8_ = IStack_2e8;
    si.optionalValue._24_8_ = TStack_2e0._0_8_;
    si.optionalValue._32_4_ = TStack_2e0.z;
    si.optionalValue._36_4_ = uVar9;
    si.optionalValue._40_4_ = uVar10;
    si.optionalValue._44_4_ = local_2cc;
    bVar24 = BSDF::HasReflection(bsdf);
    if ((!bVar24) || (bVar24 = BSDF::HasTransmission(bsdf), bVar24)) {
      bVar24 = BSDF::HasTransmission(bsdf);
      if ((!bVar24) || (bVar24 = BSDF::HasReflection(bsdf), bVar24)) goto LAB_00418569;
      VVar279 = Tuple3<pbrt::Vector3,_float>::operator-
                          (&(intr->wo).super_Tuple3<pbrt::Vector3,_float>);
      auVar258._0_8_ = VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar258._8_56_ = auVar152;
      w = &si;
      uVar151 = vmovlps_avx(auVar258._0_16_);
      si.optionalValue._8_4_ = VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
      si.optionalValue.__align = (anon_struct_8_0_00000001_for___align)uVar151;
    }
    else {
      w = (optional<pbrt::ShapeIntersection> *)&intr->wo;
    }
    PVar280 = Interaction::OffsetRayOrigin(intr,(Vector3f *)w);
    auVar153._0_4_ = PVar280.super_Tuple3<pbrt::Point3,_float>.z;
    auVar271._0_8_ = PVar280.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar271._8_56_ = auVar152;
    auVar153._4_4_ = auVar153._0_4_;
    auVar153._8_4_ = auVar153._0_4_;
    auVar153._12_4_ = auVar153._0_4_;
    local_2f8 = vshufps_avx(auVar271._0_16_,auVar271._0_16_,0x50);
    IStack_2e8 = (Interval)vmovlps_avx(auVar153);
  }
LAB_00418569:
  FVar50 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  LightSamplerHandle::Sample
            (&sampledLight,&this->lightSampler,(LightSampleContext *)local_2f8,FVar50);
  PVar54 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  uStack_560 = extraout_XMM0_Qb;
  local_568._0_4_ = PVar54.super_Tuple2<pbrt::Point2,_float>.x;
  local_568._4_4_ = PVar54.super_Tuple2<pbrt::Point2,_float>.y;
  if (sampledLight.set == false) {
    SampledSpectrum::SampledSpectrum(&local_360,0.0);
    goto LAB_0041870c;
  }
  pSVar27 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
  local_270 = (SampledSpectrum *)
              (pSVar27->light).
              super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              .bits;
  if (local_270 == (SampledSpectrum *)0x0) {
LAB_0041b1a6:
    LogFatal<char_const(&)[43]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
               ,0x509,"Check failed: %s",(char (*) [43])"light != nullptr && sampledLight->pdf != 0"
              );
  }
  pSVar27 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
  if ((pSVar27->pdf == 0.0) && (!NAN(pSVar27->pdf))) goto LAB_0041b1a6;
  local_4b8._0_8_ = &si;
  local_4b8._16_8_ = &local_558;
  local_4b8._8_8_ = &local_398;
  unique0x00005300 = &lightRay;
  si.optionalValue._32_4_ = TStack_2e0.z;
  si.optionalValue._36_4_ = fStack_2d4;
  si.optionalValue._40_4_ = fStack_2d0;
  si.optionalValue._44_4_ = local_2cc;
  si.optionalValue._0_16_ = local_2f8;
  si.optionalValue._16_4_ = IStack_2e8.low;
  si.optionalValue._20_4_ = IStack_2e8.high;
  si.optionalValue._24_4_ = TStack_2e0.x;
  si.optionalValue._28_4_ = TStack_2e0.y;
  local_558.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)(lambda->lambda).values;
  uVar151 = *(undefined8 *)((lambda->lambda).values + 2);
  uVar150 = *(undefined8 *)(lambda->pdf).values;
  uVar14 = *(undefined8 *)((lambda->pdf).values + 2);
  lightRay.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_558.o.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar151;
  local_558.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar151 >> 0x20);
  local_558.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar150;
  local_558.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar150 >> 0x20);
  local_558.time = (Float)uVar14;
  local_558._28_4_ = SUB84((ulong)uVar14 >> 0x20,0);
  local_398.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(_local_568);
  local_600._0_8_ = local_270;
  auVar258 = ZEXT1664(auVar48);
  auVar271 = ZEXT1664(auVar252);
  auVar277 = ZEXT1664(auVar49);
  DispatchSplit<9>::operator()
            (&ls,(DispatchSplit<9> *)&sigma_a_3,local_600,(ulong)local_270 >> 0x30);
  if (ls.set == true) {
    pLVar28 = pstd::optional<pbrt::LightLiSample>::value(&ls);
    bVar24 = SampledSpectrum::operator_cast_to_bool(&pLVar28->L);
    if (bVar24) {
      pLVar28 = pstd::optional<pbrt::LightLiSample>::value(&ls);
      if ((pLVar28->pdf != 0.0) || (NAN(pLVar28->pdf))) {
        pSVar27 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
        fVar267 = pSVar27->pdf;
        pLVar28 = pstd::optional<pbrt::LightLiSample>::value(&ls);
        local_34c = fVar267 * pLVar28->pdf;
        local_288.values.values._0_12_ = ZEXT812(0);
        local_288.values.values[3] = 0.0;
        pVVar1 = &intr->wo;
        uVar6 = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
        uVar7 = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
        local_658._4_4_ = uVar7;
        local_658._0_4_ = uVar6;
        wo_00 = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
        wo = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
        woRender_00 = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
        woRender = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
        local_658._8_8_ = 0;
        auVar48._12_4_ = 0;
        auVar48._0_12_ = stack0xfffffffffffffa9c;
        _local_568 = auVar48 << 0x20;
        pLVar28 = pstd::optional<pbrt::LightLiSample>::value(&ls);
        wi.super_Tuple3<pbrt::Vector3,_float>.z = (pLVar28->wi).super_Tuple3<pbrt::Vector3,_float>.z
        ;
        pVVar1 = &pLVar28->wi;
        wi.super_Tuple3<pbrt::Vector3,_float>.x = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
        wi.super_Tuple3<pbrt::Vector3,_float>.y = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
        if (bsdf == (BSDF *)0x0) {
          bVar24 = Interaction::IsMediumInteraction(intr);
          if (!bVar24) {
            LogFatal<char_const(&)[27]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                       ,0x51d,"Check failed: %s",(char (*) [27])"intr.IsMediumInteraction()");
          }
          pMVar29 = Interaction::AsMedium(intr);
          wi_00.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
          wi_00.super_Tuple3<pbrt::Vector3,_float>.x = wi.super_Tuple3<pbrt::Vector3,_float>.x;
          wi_00.super_Tuple3<pbrt::Vector3,_float>.y = wi.super_Tuple3<pbrt::Vector3,_float>.y;
          local_4b8._0_8_ = (pMVar29->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
          FVar50 = PhaseFunctionHandle::p((PhaseFunctionHandle *)local_4b8,(Vector3f)wo,wi_00);
          SampledSpectrum::SampledSpectrum((SampledSpectrum *)&si,FVar50);
          wi_01.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
          wi_01.super_Tuple3<pbrt::Vector3,_float>.x = wi.super_Tuple3<pbrt::Vector3,_float>.x;
          wi_01.super_Tuple3<pbrt::Vector3,_float>.y = wi.super_Tuple3<pbrt::Vector3,_float>.y;
          local_288.values.values = (array<float,_4>)(array<float,_4>)si.optionalValue._0_16_;
          FVar50 = PhaseFunctionHandle::PDF((PhaseFunctionHandle *)local_4b8,(Vector3f)wo_00,wi_01);
        }
        else {
          auVar249 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
          auVar152 = ZEXT856(0);
          SVar283 = BSDF::f(bsdf,(Vector3f)woRender,
                            (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,Radiance);
          auVar161._0_8_ = SVar283.values.values._8_8_;
          auVar161._8_56_ = auVar249;
          auVar256._0_8_ = SVar283.values.values._0_8_;
          auVar256._8_56_ = auVar152;
          si.optionalValue._0_16_ = vmovlhps_avx(auVar256._0_16_,auVar161._0_16_);
          pSVar26 = Interaction::AsSurface(intr);
          tVar51 = AbsDot<float>(&wi,&(pSVar26->shading).n);
          auVar152 = extraout_var_00;
          SVar283 = SampledSpectrum::operator*((SampledSpectrum *)&si,tVar51);
          auVar162._0_8_ = SVar283.values.values._8_8_;
          auVar162._8_56_ = auVar249;
          auVar62._0_8_ = SVar283.values.values._0_8_;
          auVar62._8_56_ = auVar152;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.x = wi.super_Tuple3<pbrt::Vector3,_float>.x;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.y = wi.super_Tuple3<pbrt::Vector3,_float>.y;
          local_288.values.values = (array<float,_4>)vmovlhps_avx(auVar62._0_16_,auVar162._0_16_);
          FVar50 = BSDF::PDF(bsdf,(Vector3f)woRender_00,wiRender,Radiance,All);
        }
        bVar24 = SampledSpectrum::operator_cast_to_bool(&local_288);
        if (bVar24) {
          pLVar28 = pstd::optional<pbrt::LightLiSample>::value(&ls);
          Interaction::SpawnRayTo(&lightRay,intr,&pLVar28->pLight);
          SampledSpectrum::SampledSpectrum(&T_ray,1.0);
          SampledSpectrum::SampledSpectrum(&lightPathPDF,1.0);
          this_02 = (pbrt *)&uniPathPDF;
          SampledSpectrum::SampledSpectrum((SampledSpectrum *)this_02,1.0);
          PVar282.super_Tuple3<pbrt::Point3,_float>.y =
               lightRay.o.super_Tuple3<pbrt::Point3,_float>.y;
          PVar282.super_Tuple3<pbrt::Point3,_float>.x =
               lightRay.o.super_Tuple3<pbrt::Point3,_float>.x;
          PVar282.super_Tuple3<pbrt::Point3,_float>.z =
               lightRay.o.super_Tuple3<pbrt::Point3,_float>.z;
          sequenceIndex = Hash<pbrt::Point3<float>>(this_02,PVar282);
          VVar279.super_Tuple3<pbrt::Vector3,_float>.y =
               lightRay.d.super_Tuple3<pbrt::Vector3,_float>.y;
          VVar279.super_Tuple3<pbrt::Vector3,_float>.x =
               lightRay.d.super_Tuple3<pbrt::Vector3,_float>.x;
          VVar279.super_Tuple3<pbrt::Vector3,_float>.z =
               lightRay.d.super_Tuple3<pbrt::Vector3,_float>.z;
          seed = Hash<pbrt::Vector3<float>>(this_02,VVar279);
          RNG::SetSequence(&rng,sequenceIndex,seed);
          local_368 = &local_420;
          do {
            auVar152 = ZEXT856(0);
            if ((((lightRay.d.super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
                 (lightRay.d.super_Tuple3<pbrt::Vector3,_float>.y == 0.0)) &&
                (lightRay.d.super_Tuple3<pbrt::Vector3,_float>.z == 0.0)) &&
               (!NAN(lightRay.d.super_Tuple3<pbrt::Vector3,_float>.z))) goto LAB_0041aff5;
            auVar152 = ZEXT856(0);
            Integrator::Intersect(&si,(Integrator *)this,&lightRay,0.9999);
            if (si.set == true) {
              pSVar30 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
              if (((pSVar30->intr).material.
                   super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                   .bits & 0xffffffffffff) == 0) goto LAB_00418a7e;
LAB_0041afc5:
              SampledSpectrum::SampledSpectrum(&local_360,0.0);
              pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
              goto LAB_004186ec;
            }
LAB_00418a7e:
            if (lightRay.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits != 0) {
              FVar53 = 0.9999;
              uVar38 = lightRay._8_8_;
              uVar151 = lightRay.d.super_Tuple3<pbrt::Vector3,_float>._4_8_;
              if (si.set == true) {
                pSVar30 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
                FVar53 = pSVar30->tHit;
                uVar38 = lightRay._8_8_;
                uVar151 = lightRay.d.super_Tuple3<pbrt::Vector3,_float>._4_8_;
              }
              MVar22.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = lightRay.medium.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits;
              FVar21 = lightRay.time;
              lightRay.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar151;
              fVar267 = lightRay.d.super_Tuple3<pbrt::Vector3,_float>.y;
              local_658._0_4_ = FVar53;
              uVar16 = CONCAT44(lightRay.o.super_Tuple3<pbrt::Point3,_float>.y,
                                lightRay.o.super_Tuple3<pbrt::Point3,_float>.x);
              auVar259._8_4_ = lightRay.time;
              auVar259._0_4_ = (float)uVar151;
              auVar259._4_4_ = SUB84(uVar151,4);
              uVar17 = auVar259._4_8_;
              auVar152 = ZEXT856(uVar17);
              lightRay._8_8_ = uVar38;
              lightRay.d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = uVar151;
              fVar52 = RNG::Uniform<float>(&rng);
              MVar23 = lightRay.medium;
              local_568._0_4_ = fVar52;
              this_01 = (DenselySampledSpectrum *)
                        ((ulong)lightRay.medium.
                                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                                .bits & 0xffffffffffff);
              if ((ulong)lightRay.medium.
                         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                         .bits < 0x3000000000000) {
                if (((ulong)lightRay.medium.
                            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                            .bits & 0x3000000000000) == 0x2000000000000) {
                  sigma_a_3.values.values._8_8_ = &lightPathPDF;
                  sigma_a_3.values.values._0_8_ = &T_ray;
                  local_398.d.super_Tuple3<pbrt::Vector3,_float>.y = fVar267;
                  local_398.medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits = MVar22.
                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                          .bits;
                  local_640 = FVar53;
                  local_398.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = uVar16;
                  local_398._20_8_ = uVar17;
                  local_398._8_8_ = uVar38;
                  SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
                  Transform::ApplyInverse
                            (&local_558,(Transform *)(this_01 + 3),&local_398,&local_640);
                  tVar51 = Length<float>(&local_558.d);
                  local_640 = tVar51 * local_640;
                  auVar249 = (undefined1  [56])0x0;
                  VVar279 = Normalize<float>(&local_558.d);
                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.z =
                       VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar63._0_8_ = VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar63._8_56_ = auVar249;
                  uVar151 = vmovlps_avx(auVar63._0_16_);
                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar151;
                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar151 >> 0x20)
                  ;
                  pvVar2 = &this_01->values;
                  bVar24 = Bounds3<float>::IntersectP
                                     ((Bounds3<float> *)pvVar2,&local_558.o,&local_558.d,local_640,
                                      &tMin,&tMax);
                  auVar278 = auVar277._4_12_;
                  auVar272 = auVar271._4_12_;
                  auVar259 = auVar258._4_12_;
                  if (bVar24) {
                    FVar53 = *(Float *)&this_01[2].values.nStored;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&(this_01->values).nStored,lambda
                                        );
                    auVar163._0_8_ = SVar283.values.values._8_8_;
                    auVar163._8_56_ = auVar152;
                    auVar64._0_8_ = SVar283.values.values._0_8_;
                    auVar64._8_56_ = auVar249;
                    auVar48 = vmovlhps_avx(auVar64._0_16_,auVar163._0_16_);
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)local_4b8,FVar53);
                    auVar164._0_8_ = SVar283.values.values._8_8_;
                    auVar164._8_56_ = auVar152;
                    auVar65._0_8_ = SVar283.values.values._0_8_;
                    auVar65._8_56_ = auVar249;
                    sigma_a.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar65._0_16_,auVar164._0_16_);
                    FVar53 = *(Float *)&this_01[2].values.nStored;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&this_01[1].values.nStored,lambda
                                        );
                    auVar165._0_8_ = SVar283.values.values._8_8_;
                    auVar165._8_56_ = auVar152;
                    auVar66._0_8_ = SVar283.values.values._0_8_;
                    auVar66._8_56_ = auVar249;
                    auVar48 = vmovlhps_avx(auVar66._0_16_,auVar165._0_16_);
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)local_4b8,FVar53);
                    auVar166._0_8_ = SVar283.values.values._8_8_;
                    auVar166._8_56_ = auVar152;
                    auVar67._0_8_ = SVar283.values.values._0_8_;
                    auVar67._8_56_ = auVar249;
                    sigma_s.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar67._0_16_,auVar166._0_16_);
                    auVar249 = ZEXT856(sigma_s.values.values._8_8_);
                    SVar283 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
                    auVar167._0_8_ = SVar283.values.values._8_8_;
                    auVar167._8_56_ = auVar152;
                    auVar68._0_8_ = SVar283.values.values._0_8_;
                    auVar68._8_56_ = auVar249;
                    sigma_t.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar68._0_16_,auVar167._0_16_);
                    auVar152 = ZEXT856(sigma_t.values.values._8_8_);
                    VVar279 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar2);
                    auVar248 = auVar167._4_60_;
                    auVar69._0_8_ = VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar69._8_56_ = auVar152;
                    local_638 = auVar69._0_16_;
                    VVar281 = Bounds3<float>::Offset((Bounds3<float> *)pvVar2,&local_558.o);
                    local_600._8_4_ = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar70._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar70._8_56_ = auVar152;
                    auVar250._4_4_ = local_558.d.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar250._0_4_ = local_558.d.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar250._8_8_ = 0;
                    local_600._0_8_ = vmovlps_avx(auVar70._0_16_);
                    auVar152 = (undefined1  [56])0x0;
                    auVar48 = vdivps_avx(auVar250,local_638);
                    uStack_5f0._4_4_ =
                         local_558.d.super_Tuple3<pbrt::Vector3,_float>.z /
                         VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                    uVar151 = vmovlps_avx(auVar48);
                    fStack_5f4 = (float)uVar151;
                    uStack_5f0._0_4_ = (float)((ulong)uVar151 >> 0x20);
                    local_5e8 = (RNG *)((ulong)local_5e8 & 0xffffffff00000000);
                    local_5e0.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                             )0;
                    PVar280 = Ray::operator()((Ray *)local_600,tMin);
                    auVar168._0_4_ = PVar280.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar168._4_60_ = auVar248;
                    auVar71._0_8_ = PVar280.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar71._8_56_ = auVar152;
                    piVar3 = &this_01[7].lambda_max;
                    iVar25 = this_01[7].lambda_min;
                    auVar252 = vmovshdup_avx(auVar71._0_16_);
                    auVar153 = ZEXT816(0) << 0x40;
                    pvVar2 = &this_01[7].values;
                    pDVar4 = this_01 + 7;
                    lVar42 = 0;
                    iVar37 = this_01[7].lambda_max;
                    local_638._0_8_ = pvVar2;
                    fVar52 = (float)iVar37;
                    auVar261._0_4_ = (float)(iVar37 + -1);
                    auVar261._4_12_ = auVar259;
                    auVar49 = ZEXT416((uint)(auVar252._0_4_ * fVar52));
                    auVar48 = vminss_avx(auVar261,auVar49);
                    uVar151 = vcmpss_avx512f(auVar49,auVar153,1);
                    fVar257 = (float)iVar25;
                    auVar258 = ZEXT1664(CONCAT124(auVar272,fVar257));
                    auVar268._0_4_ = (float)(iVar25 + -1);
                    auVar268._4_12_ = auVar272;
                    iVar36 = *(int *)&this_01[7].values.alloc.memoryResource;
                    iVar31 = (int)(float)((uint)!(bool)((byte)uVar151 & 1) * auVar48._0_4_);
                    auVar49 = ZEXT416((uint)(PVar280.super_Tuple3<pbrt::Point3,_float>.x * fVar257))
                    ;
                    auVar48 = vminss_avx(auVar268,auVar49);
                    uVar151 = vcmpss_avx512f(auVar49,auVar153,1);
                    fVar260 = (float)iVar36;
                    auVar274._0_4_ = (float)(iVar36 + -1);
                    auVar274._4_12_ = auVar278;
                    fVar267 = (float)((uint)!(bool)((byte)uVar151 & 1) * auVar48._0_4_);
                    auVar46._4_12_ = auVar48._4_12_;
                    auVar46._0_4_ = fVar267;
                    iVar36 = (int)fVar267;
                    auVar48 = vminss_avx(auVar274,ZEXT416((uint)(auVar168._0_4_ * fVar260)));
                    uVar151 = vcmpss_avx512f(ZEXT416((uint)(auVar168._0_4_ * fVar260)),auVar153,1);
                    iVar40 = (int)(float)((uint)!(bool)((byte)uVar151 & 1) * auVar48._0_4_);
                    auVar277 = ZEXT464((uint)tMin);
                    local_658._0_4_ = tMin;
                    for (; auVar271 = ZEXT1664(auVar46), lVar42 != 3; lVar42 = lVar42 + 1) {
                      iVar41 = (int)lVar42;
                      if (iVar41 == 1) {
                        voxel[1] = iVar31;
                        piVar43 = voxelLimit + 1;
                        piVar44 = step + 1;
                        pFVar45 = deltaT + 1;
                        pfVar35 = nextCrossingT + 1;
                        pfVar33 = (float *)&uStack_5f0;
                        iVar34 = iVar31;
                      }
                      else if (iVar41 == 0) {
                        voxel[lVar42] = iVar36;
                        piVar43 = voxelLimit;
                        piVar44 = step;
                        pFVar45 = deltaT;
                        pfVar35 = nextCrossingT;
                        pfVar33 = &fStack_5f4;
                        iVar34 = iVar36;
                      }
                      else {
                        piVar43 = voxelLimit + 2;
                        piVar44 = step + 2;
                        pFVar45 = deltaT + 2;
                        pfVar35 = nextCrossingT + 2;
                        pfVar33 = (float *)((long)&uStack_5f0 + 4);
                        voxel[lVar42] = iVar40;
                        iVar34 = iVar40;
                      }
                      if ((*pfVar33 == 0.0) && (!NAN(*pfVar33))) {
                        pfVar33 = &fStack_5f4;
                        if ((iVar41 != 0) && (pfVar33 = (float *)&uStack_5f0, iVar41 != 1)) {
                          pfVar33 = (float *)((long)&uStack_5f0 + 4);
                        }
                        *pfVar33 = 0.0;
                      }
                      pfVar33 = &fStack_5f4;
                      if ((iVar41 != 0) && (pfVar33 = (float *)&uStack_5f0, iVar41 != 1)) {
                        pfVar33 = (float *)((long)&uStack_5f0 + 4);
                      }
                      if (0.0 <= *pfVar33) {
                        pfVar33 = &fStack_5f4;
                        pDVar32 = pDVar4;
                        fVar267 = fVar257;
                        fVar273 = PVar280.super_Tuple3<pbrt::Point3,_float>.x;
                        if ((iVar41 != 0) &&
                           (pfVar33 = (float *)&uStack_5f0,
                           pDVar32 = (DenselySampledSpectrum *)piVar3, fVar267 = fVar52,
                           fVar273 = auVar252._0_4_, iVar41 != 1)) {
                          pfVar33 = (float *)((long)&uStack_5f0 + 4);
                          pDVar32 = (DenselySampledSpectrum *)pvVar2;
                          fVar267 = fVar260;
                          fVar273 = auVar168._0_4_;
                        }
                        *piVar44 = 1;
                        fVar5 = *pfVar33;
                        fVar273 = ((float)(iVar34 + 1) / fVar267 - fVar273) / fVar5 + tMin;
                        auVar277 = ZEXT464((uint)fVar273);
                        *pfVar35 = fVar273;
                        *pFVar45 = 1.0 / (fVar5 * fVar267);
                        iVar41 = *(int *)&((polymorphic_allocator<float> *)&pDVar32->lambda_min)->
                                          memoryResource;
                      }
                      else {
                        pfVar33 = &fStack_5f4;
                        auVar277 = ZEXT1664(auVar71._0_16_);
                        pDVar32 = pDVar4;
                        fVar267 = fVar257;
                        if (iVar41 != 0) {
                          pfVar33 = (float *)&uStack_5f0;
                          auVar277 = ZEXT1664(auVar252);
                          pDVar32 = (DenselySampledSpectrum *)piVar3;
                          fVar267 = fVar52;
                          if (iVar41 != 1) {
                            pfVar33 = (float *)((long)&uStack_5f0 + 4);
                            auVar277 = ZEXT1664(auVar168._0_16_);
                            pDVar32 = (DenselySampledSpectrum *)pvVar2;
                            fVar267 = fVar260;
                          }
                        }
                        fVar273 = *pfVar33;
                        *pfVar35 = ((float)iVar34 / fVar267 - auVar277._0_4_) / fVar273 + tMin;
                        iVar41 = *(int *)&((polymorphic_allocator<float> *)&pDVar32->lambda_min)->
                                          memoryResource;
                        *piVar44 = -1;
                        *pFVar45 = -1.0 / (fVar273 * (float)iVar41);
                        iVar41 = -1;
                      }
                      auVar46 = ZEXT416(0);
                      *piVar43 = iVar41;
                    }
                    while( true ) {
                      iVar36 = *(int *)(&DAT_0053dd60 +
                                       (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                              (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                              (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
                      fVar267 = nextCrossingT[iVar36];
                      auVar249 = (undefined1  [56])0x0;
                      auVar48 = vminss_avx(ZEXT416((uint)fVar267),ZEXT416((uint)tMax));
                      fVar52 = auVar48._0_4_;
                      auVar152 = (undefined1  [56])0x0;
                      SVar283 = SampledSpectrum::operator*
                                          (&sigma_t,this_01[6].values.ptr
                                                    [(long)((iVar37 * voxel[2] + voxel[1]) * iVar25)
                                                     + (long)voxel[0]]);
                      auVar187._0_8_ = SVar283.values.values._8_8_;
                      auVar187._8_56_ = auVar249;
                      auVar97._0_8_ = SVar283.values.values._0_8_;
                      auVar97._8_56_ = auVar152;
                      auVar256 = ZEXT1664(auVar97._0_16_);
                      sigma_maj.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar97._0_16_,auVar187._0_16_);
                      auVar152 = ZEXT856(sigma_maj.values.values._8_8_);
                      if ((SVar283.values.values[0] != 0.0) || (NAN(SVar283.values.values[0]))) {
                        while( true ) {
                          FVar53 = SampleExponential((Float)local_568._0_4_,auVar256._0_4_);
                          local_638._0_4_ = FVar53;
                          fVar257 = RNG::Uniform<float>(&rng);
                          auVar252 = auVar277._0_16_;
                          auVar48 = auVar271._0_16_;
                          local_568._0_4_ = fVar257;
                          auVar152 = (undefined1  [56])0x0;
                          fVar257 = (float)local_638._0_4_ + (float)local_658._0_4_;
                          auVar249 = (undefined1  [56])0x0;
                          if (fVar52 <= fVar257) break;
                          auVar152 = (undefined1  [56])0x0;
                          if (fVar257 < tMax) {
                            local_638._0_4_ = fVar257;
                            SVar283 = SampledSpectrum::operator-(&sigma_maj);
                            auVar191._0_8_ = SVar283.values.values._8_8_;
                            auVar191._8_56_ = auVar249;
                            auVar101._0_8_ = SVar283.values.values._0_8_;
                            auVar101._8_56_ = auVar152;
                            d.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar101._0_16_,auVar191._0_16_);
                            auVar152 = (undefined1  [56])0x0;
                            SVar283 = SampledSpectrum::operator*
                                                (&d,(float)local_638._0_4_ - (float)local_658._0_4_)
                            ;
                            auVar192._0_8_ = SVar283.values.values._8_8_;
                            auVar192._8_56_ = auVar249;
                            auVar102._0_8_ = SVar283.values.values._0_8_;
                            auVar102._8_56_ = auVar152;
                            auVar49 = vmovlhps_avx(auVar102._0_16_,auVar192._0_16_);
                            auVar152 = ZEXT856(auVar49._8_8_);
                            local_4b8._0_8_ = auVar49._0_8_;
                            local_4b8._8_4_ = auVar49._8_4_;
                            local_4b8._12_4_ = auVar49._12_4_;
                            SVar283 = FastExp((SampledSpectrum *)local_4b8);
                            auVar193._0_8_ = SVar283.values.values._8_8_;
                            auVar193._8_56_ = auVar249;
                            auVar103._0_8_ = SVar283.values.values._0_8_;
                            auVar103._8_56_ = auVar152;
                            Tmaj_1.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar103._0_16_,auVar193._0_16_);
                            auVar152 = (undefined1  [56])0x0;
                            PVar280 = Ray::operator()(&local_558,(Float)local_638._0_4_);
                            local_590.z = PVar280.super_Tuple3<pbrt::Point3,_float>.z;
                            auVar104._0_8_ = PVar280.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            auVar104._8_56_ = auVar152;
                            local_590._0_8_ = vmovlps_avx(auVar104._0_16_);
                            SVar283 = UniformGridMediumProvider::Density
                                                (*(UniformGridMediumProvider **)this_01,
                                                 (Point3f *)&local_590,lambda);
                            auVar194._0_8_ = SVar283.values.values._8_8_;
                            auVar194._8_56_ = auVar249;
                            auVar105._0_8_ = SVar283.values.values._0_8_;
                            auVar105._8_56_ = auVar152;
                            d.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar105._0_16_,auVar194._0_16_);
                            p.super_Tuple3<pbrt::Point3,_float>.z = local_590.z;
                            p.super_Tuple3<pbrt::Point3,_float>.x = local_590.x;
                            p.super_Tuple3<pbrt::Point3,_float>.y = local_590.y;
                            auVar152 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                            uVar150 = 0;
                            SVar283 = UniformGridMediumProvider::Le
                                                (*(UniformGridMediumProvider **)this_01,p,lambda);
                            auVar195._0_8_ = SVar283.values.values._8_8_;
                            auVar195._8_56_ = auVar152;
                            local_658._8_8_ = uVar150;
                            local_658._0_8_ = SVar283.values.values._0_8_;
                            SVar283 = SampledSpectrum::operator*(&sigma_a,&d);
                            auVar196._0_8_ = SVar283.values.values._8_8_;
                            auVar196._8_56_ = auVar152;
                            uStack_200 = auVar152._0_8_;
                            auVar152 = ZEXT856(uStack_200);
                            uVar151 = uVar150;
                            SVar284 = SampledSpectrum::operator*(&sigma_s,&d);
                            auVar197._0_8_ = SVar284.values.values._8_8_;
                            auVar197._8_56_ = auVar152;
                            local_298._8_8_ = uVar151;
                            local_298._0_8_ = SVar284.values.values._0_8_;
                            local_2a8 = auVar197._0_16_;
                            SampledSpectrum::operator*=(&Tmaj_1,&TmajAccum);
                            auVar248 = auVar197._4_60_;
                            SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_4b8,1.0);
                            uVar38 = CONCAT44(local_4b8._12_4_,local_4b8._8_4_);
                            TmajAccum.values.values[2] = (float)local_4b8._8_4_;
                            TmajAccum.values.values[3] = (float)local_4b8._12_4_;
                            TmajAccum.values.values[0] = (float)local_4b8._0_4_;
                            TmajAccum.values.values[1] = (float)local_4b8._4_4_;
                            PVar282 = Transform::operator()
                                                ((Transform *)(this_01 + 3),
                                                 (Point3<float> *)&local_590);
                            auVar198._0_4_ = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
                            auVar198._4_60_ = auVar248;
                            local_2b8._8_8_ = uVar38;
                            local_2b8._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            local_2c8 = auVar198._0_16_;
                            VVar279 = Normalize<float>(&local_398.d);
                            pSVar20 = local_368;
                            auVar253._8_4_ = 0x80000000;
                            auVar253._0_8_ = 0x8000000080000000;
                            auVar253._12_4_ = 0x80000000;
                            auVar264._4_4_ = local_2c8._0_4_;
                            auVar264._0_4_ = local_2c8._0_4_;
                            auVar264._8_4_ = local_2c8._0_4_;
                            auVar264._12_4_ = local_2c8._0_4_;
                            local_440 = (SampledSpectrum)(SampledSpectrum)sigma_maj.values.values;
                            local_490 = ZEXT816(0);
                            auVar55._0_8_ =
                                 VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                 0x8000000080000000;
                            auVar55._8_8_ = uVar38 ^ auVar253._8_8_;
                            fStack_494 = -VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                            auVar49 = vpermilps_avx(local_2b8,0x50);
                            local_480 = 0.0;
                            local_4b8._0_8_ = auVar49._0_8_;
                            local_4b8._8_4_ = auVar49._8_4_;
                            local_4b8._12_4_ = auVar49._12_4_;
                            uVar151 = vmovlps_avx(auVar264);
                            local_4b8._16_4_ = (undefined4)uVar151;
                            local_4b8._20_4_ = (undefined4)((ulong)uVar151 >> 0x20);
                            local_4b8._24_4_ = local_398.time;
                            uVar151 = vmovlpd_avx(auVar55);
                            fStack_49c = (float)uVar151;
                            fStack_498 = (float)((ulong)uVar151 >> 0x20);
                            auVar59._16_16_ = local_2a8;
                            auVar59._0_16_ = auVar55;
                            local_478 = (MediumInterface *)0x0;
                            local_470 = MVar23.
                                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                                        .bits;
                            auVar155._16_16_ = auVar196._0_16_;
                            auVar155._0_16_ = auVar55;
                            auVar61 = vperm2f128_avx(auVar155,auVar59,0x31);
                            auVar156._8_8_ = uVar150;
                            auVar156._0_8_ = SVar283.values.values._0_8_;
                            auVar156._16_16_ = local_298;
                            _local_460 = vunpcklpd_avx(auVar156,auVar61);
                            local_430.values.values =
                                 (array<float,_4>)vunpcklpd_avx(local_658,auVar195._0_16_);
                            *(undefined8 *)(local_368->values).values = Tmaj_1.values.values._0_8_;
                            *(undefined8 *)((pSVar20->values).values + 2) =
                                 Tmaj_1.values.values._8_8_;
                            auVar258 = ZEXT1664(auVar49);
                            auVar271 = ZEXT1664(auVar48);
                            auVar277 = ZEXT1664(auVar252);
                            local_468.bits =
                                 (ulong)((long)&this_01[2].values.nStored + 4U) | 0x1000000000000;
                            bVar24 = SampleLd::anon_class_32_4_3820c045::operator()
                                               ((anon_class_32_4_3820c045 *)&sigma_a_3,
                                                (MediumSample *)local_4b8);
                            if (!bVar24) goto LAB_0041ac65;
                            fVar257 = (float)local_638._0_4_;
                          }
                          auVar256 = ZEXT464((uint)sigma_maj.values.values[0]);
                          local_658._0_4_ = fVar257;
                        }
                        SVar283 = SampledSpectrum::operator-(&sigma_maj);
                        auVar199._0_8_ = SVar283.values.values._8_8_;
                        auVar199._8_56_ = auVar249;
                        auVar106._0_8_ = SVar283.values.values._0_8_;
                        auVar106._8_56_ = auVar152;
                        d.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar106._0_16_,auVar199._0_16_);
                        auVar152 = (undefined1  [56])0x0;
                        SVar283 = SampledSpectrum::operator*(&d,fVar52 - (float)local_658._0_4_);
                        auVar200._0_8_ = SVar283.values.values._8_8_;
                        auVar200._8_56_ = auVar249;
                        auVar107._0_8_ = SVar283.values.values._0_8_;
                        auVar107._8_56_ = auVar152;
                        Tmaj_1.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar107._0_16_,auVar200._0_16_);
                        auVar152 = ZEXT856(Tmaj_1.values.values._8_8_);
                        SVar283 = FastExp(&Tmaj_1);
                        auVar201._0_8_ = SVar283.values.values._8_8_;
                        auVar201._8_56_ = auVar249;
                        auVar252 = auVar201._0_16_;
                        auVar108._0_8_ = SVar283.values.values._0_8_;
                        auVar108._8_56_ = auVar152;
                        auVar48 = auVar108._0_16_;
                      }
                      else {
                        SVar283 = SampledSpectrum::operator-(&sigma_maj);
                        auVar188._0_8_ = SVar283.values.values._8_8_;
                        auVar188._8_56_ = auVar249;
                        auVar98._0_8_ = SVar283.values.values._0_8_;
                        auVar98._8_56_ = auVar152;
                        d.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar98._0_16_,auVar188._0_16_);
                        auVar152 = (undefined1  [56])0x0;
                        SVar283 = SampledSpectrum::operator*(&d,fVar52 - (float)local_658._0_4_);
                        auVar189._0_8_ = SVar283.values.values._8_8_;
                        auVar189._8_56_ = auVar249;
                        auVar99._0_8_ = SVar283.values.values._0_8_;
                        auVar99._8_56_ = auVar152;
                        Tmaj_1.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar99._0_16_,auVar189._0_16_);
                        auVar152 = ZEXT856(Tmaj_1.values.values._8_8_);
                        SVar283 = FastExp(&Tmaj_1);
                        auVar190._0_8_ = SVar283.values.values._8_8_;
                        auVar190._8_56_ = auVar249;
                        auVar252 = auVar190._0_16_;
                        auVar100._0_8_ = SVar283.values.values._0_8_;
                        auVar100._8_56_ = auVar152;
                        auVar48 = auVar100._0_16_;
                      }
                      auVar48 = vmovlhps_avx(auVar48,auVar252);
                      local_4b8._0_8_ = auVar48._0_8_;
                      local_4b8._8_4_ = auVar48._8_4_;
                      local_4b8._12_4_ = auVar48._12_4_;
                      SampledSpectrum::operator*=(&TmajAccum,(SampledSpectrum *)local_4b8);
                      if ((tMax < fVar267) ||
                         (iVar25 = voxel[iVar36], voxel[iVar36] = iVar25 + step[iVar36],
                         iVar25 + step[iVar36] == voxelLimit[iVar36])) break;
                      local_658._0_4_ = fVar52;
                      nextCrossingT[iVar36] = fVar267 + deltaT[iVar36];
                      iVar25 = *(int *)&((polymorphic_allocator<float> *)&pDVar4->lambda_min)->
                                        memoryResource;
                      iVar37 = *piVar3;
                    }
                    goto LAB_0041ac65;
                  }
                  SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_4b8,1.0);
                  goto LAB_0041ac77;
                }
                local_600._0_8_ = &T_ray;
                unique0x00005300 = &lightPathPDF;
                uStack_5f0 = &uniPathPDF;
                local_5e8 = &rng;
                local_558.time = FVar21;
                local_558.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits = MVar22.
                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                        .bits;
                local_558.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = uVar16;
                local_558.d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = uVar151;
                local_558._8_8_ = uVar38;
                tVar51 = Length<float>(&local_558.d);
                auVar249 = (undefined1  [56])0x0;
                bVar24 = ABS(tVar51 * FVar53) == INFINITY;
                VVar279 = Normalize<float>(&local_558.d);
                local_558.d.super_Tuple3<pbrt::Vector3,_float>.z =
                     VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar81._0_8_ = VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar81._8_56_ = auVar249;
                uVar151 = vmovlpd_avx(auVar81._0_16_);
                local_558.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar151;
                local_558.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar151 >> 0x20);
                auVar249 = (undefined1  [56])0x0;
                local_638._0_4_ = this_01[3].lambda_min;
                SVar283 = DenselySampledSpectrum::Sample(this_01,lambda);
                auVar175._0_8_ = SVar283.values.values._8_8_;
                auVar175._8_56_ = auVar152;
                auVar82._0_8_ = SVar283.values.values._0_8_;
                auVar82._8_56_ = auVar249;
                auVar48 = vmovlhps_avx(auVar82._0_16_,auVar175._0_16_);
                local_4b8._0_8_ = auVar48._0_8_;
                local_4b8._8_4_ = auVar48._8_4_;
                local_4b8._12_4_ = auVar48._12_4_;
                auVar249 = (undefined1  [56])0x0;
                SVar283 = SampledSpectrum::operator*
                                    ((SampledSpectrum *)local_4b8,(Float)local_638._0_4_);
                auVar176._0_8_ = SVar283.values.values._8_8_;
                auVar176._8_56_ = auVar152;
                auVar83._0_8_ = SVar283.values.values._0_8_;
                auVar83._8_56_ = auVar249;
                sigma_a_3.values.values =
                     (array<float,_4>)vmovlhps_avx(auVar83._0_16_,auVar176._0_16_);
                auVar249 = (undefined1  [56])0x0;
                local_638._0_4_ = this_01[3].lambda_min;
                SVar283 = DenselySampledSpectrum::Sample(this_01 + 1,lambda);
                auVar177._0_8_ = SVar283.values.values._8_8_;
                auVar177._8_56_ = auVar152;
                auVar84._0_8_ = SVar283.values.values._0_8_;
                auVar84._8_56_ = auVar249;
                auVar48 = vmovlhps_avx(auVar84._0_16_,auVar177._0_16_);
                local_4b8._0_8_ = auVar48._0_8_;
                local_4b8._8_4_ = auVar48._8_4_;
                local_4b8._12_4_ = auVar48._12_4_;
                auVar249 = (undefined1  [56])0x0;
                fVar267 = (float)((uint)bVar24 * 0x7f7fffff + (uint)!bVar24 * (int)(tVar51 * FVar53)
                                 );
                local_658 = ZEXT416((uint)fVar267);
                SVar283 = SampledSpectrum::operator*
                                    ((SampledSpectrum *)local_4b8,(Float)local_638._0_4_);
                auVar178._0_8_ = SVar283.values.values._8_8_;
                auVar178._8_56_ = auVar152;
                auVar85._0_8_ = SVar283.values.values._0_8_;
                auVar85._8_56_ = auVar249;
                TmajAccum.values.values =
                     (array<float,_4>)vmovlhps_avx(auVar85._0_16_,auVar178._0_16_);
                auVar249 = ZEXT856(TmajAccum.values.values._8_8_);
                SVar283 = SampledSpectrum::operator+(&sigma_a_3,&TmajAccum);
                auVar179._0_8_ = SVar283.values.values._8_8_;
                auVar179._8_56_ = auVar152;
                auVar86._0_8_ = SVar283.values.values._0_8_;
                auVar86._8_56_ = auVar249;
                sigma_a.values.values =
                     (array<float,_4>)vmovlhps_avx(auVar86._0_16_,auVar179._0_16_);
                fVar257 = SVar283.values.values[0];
                if ((fVar257 != 0.0) || (NAN(fVar257))) {
                  auVar152 = ZEXT856(auVar249._0_8_);
                  auVar133._0_4_ = SampleExponential(fVar52,fVar257);
                  auVar133._4_60_ = extraout_var;
                  if (fVar267 <= auVar133._0_4_) {
                    auVar13._8_4_ = 0x80000000;
                    auVar13._0_8_ = 0x8000000080000000;
                    auVar13._12_4_ = 0x80000000;
                    auVar48 = vxorps_avx512vl(local_658,auVar13);
                    auVar249 = ZEXT856(auVar48._8_8_);
                    SVar283 = SampledSpectrum::operator*(&sigma_a,auVar48._0_4_);
                    auVar236._0_8_ = SVar283.values.values._8_8_;
                    auVar236._8_56_ = auVar152;
                    auVar137._0_8_ = SVar283.values.values._0_8_;
                    auVar137._8_56_ = auVar249;
                    auVar48 = vmovlhps_avx(auVar137._0_16_,auVar236._0_16_);
                    auVar249 = ZEXT856(auVar48._8_8_);
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    SVar283 = FastExp((SampledSpectrum *)local_4b8);
                    auVar231._0_8_ = SVar283.values.values._8_8_;
                    auVar231._8_56_ = auVar152;
                    auVar138._0_8_ = SVar283.values.values._0_8_;
                    auVar138._8_56_ = auVar249;
                    auVar58 = auVar138._0_16_;
                  }
                  else {
                    _local_568 = auVar133._0_16_;
                    auVar249 = ZEXT856(extraout_var._4_8_);
                    auVar12._8_4_ = 0x80000000;
                    auVar12._0_8_ = 0x8000000080000000;
                    auVar12._12_4_ = 0x80000000;
                    auVar48 = vxorps_avx512vl(_local_568,auVar12);
                    auVar152 = ZEXT856(auVar48._8_8_);
                    SVar283 = SampledSpectrum::operator*(&sigma_a,auVar48._0_4_);
                    auVar232._0_8_ = SVar283.values.values._8_8_;
                    auVar232._8_56_ = auVar249;
                    auVar134._0_8_ = SVar283.values.values._0_8_;
                    auVar134._8_56_ = auVar152;
                    auVar48 = vmovlhps_avx(auVar134._0_16_,auVar232._0_16_);
                    local_658._8_8_ = auVar48._8_8_;
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    SVar283 = FastExp((SampledSpectrum *)local_4b8);
                    auVar233._0_8_ = SVar283.values.values._8_8_;
                    auVar233._8_56_ = auVar249;
                    local_658._0_8_ = SVar283.values.values._0_8_;
                    local_638 = auVar233._0_16_;
                    FVar53 = (Float)this_01[3].lambda_max;
                    auVar152 = (undefined1  [56])0x0;
                    SVar283 = DenselySampledSpectrum::Sample(this_01 + 2,lambda);
                    auVar234._0_8_ = SVar283.values.values._8_8_;
                    auVar234._8_56_ = auVar249;
                    auVar135._0_8_ = SVar283.values.values._0_8_;
                    auVar135._8_56_ = auVar152;
                    auVar48 = vmovlhps_avx(auVar135._0_16_,auVar234._0_16_);
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    uVar151 = 0;
                    SVar284 = SampledSpectrum::operator*((SampledSpectrum *)local_4b8,FVar53);
                    auVar235._0_8_ = SVar284.values.values._8_8_;
                    auVar235._8_56_ = auVar249;
                    auVar152 = ZEXT856(extraout_var._4_8_);
                    PVar280 = Ray::operator()(&local_558,auVar133._0_4_);
                    SVar283 = TmajAccum;
                    auVar154._0_4_ = PVar280.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar136._0_8_ = PVar280.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar136._8_56_ = auVar152;
                    auVar48 = vshufps_avx(auVar136._0_16_,auVar136._0_16_,0x50);
                    auVar154._4_4_ = auVar154._0_4_;
                    auVar154._8_4_ = auVar154._0_4_;
                    auVar154._12_4_ = auVar154._0_4_;
                    local_470.bits = (ulong)this_01 | 0x1000000000000;
                    local_468.bits = (ulong)&this_01[3].values | 0x1000000000000;
                    local_460._16_4_ = TmajAccum.values.values[0];
                    local_460._20_4_ = TmajAccum.values.values[1];
                    afStack_448[0] = TmajAccum.values.values[2];
                    afStack_448[1] = TmajAccum.values.values[3];
                    auVar255._0_8_ =
                         CONCAT44(local_558.d.super_Tuple3<pbrt::Vector3,_float>.y,
                                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.x) ^
                         0x8000000080000000;
                    auVar255._8_4_ = 0x80000000;
                    auVar255._12_4_ = 0x80000000;
                    fStack_494 = -local_558.d.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar258 = ZEXT464((uint)local_558.time);
                    local_440 = (SampledSpectrum)(SampledSpectrum)sigma_a.values.values;
                    local_490 = ZEXT816(0) << 0x20;
                    auVar271 = ZEXT864(0) << 0x20;
                    local_480 = 0.0;
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    auVar15._8_8_ = uVar151;
                    auVar15._0_8_ = SVar284.values.values._0_8_;
                    uVar151 = vmovlps_avx(auVar154);
                    local_4b8._16_4_ = (undefined4)uVar151;
                    local_4b8._20_4_ = (undefined4)((ulong)uVar151 >> 0x20);
                    local_4b8._24_4_ = local_558.time;
                    uVar151 = vmovlps_avx(auVar255);
                    fStack_49c = (float)uVar151;
                    fStack_498 = (float)((ulong)uVar151 >> 0x20);
                    local_478 = (MediumInterface *)0x0;
                    local_460._0_16_ = (undefined1  [16])sigma_a_3.values.values;
                    local_430.values.values =
                         (array<float,_4>)vunpcklpd_avx(auVar15,auVar235._0_16_);
                    local_420.values.values = (array<float,_4>)vunpcklpd_avx(local_658,local_638);
                    TmajAccum = SVar283;
                    SampleLd::anon_class_32_4_3820c045::operator()
                              ((anon_class_32_4_3820c045 *)local_600,(MediumSample *)local_4b8);
                    SampledSpectrum::SampledSpectrum((SampledSpectrum *)&local_398,1.0);
                    auVar58._8_8_ = 0;
                    auVar58._0_4_ = local_398.o.super_Tuple3<pbrt::Point3,_float>.x;
                    auVar58._4_4_ = local_398.o.super_Tuple3<pbrt::Point3,_float>.y;
                    auVar231 = ZEXT864((ulong)local_398._8_8_);
                  }
                }
                else {
                  auVar11._8_4_ = 0x80000000;
                  auVar11._0_8_ = 0x8000000080000000;
                  auVar11._12_4_ = 0x80000000;
                  auVar48 = vxorps_avx512vl(local_658,auVar11);
                  auVar249 = ZEXT856(auVar48._8_8_);
                  SVar283 = SampledSpectrum::operator*(&sigma_a,auVar48._0_4_);
                  auVar180._0_8_ = SVar283.values.values._8_8_;
                  auVar180._8_56_ = auVar152;
                  auVar87._0_8_ = SVar283.values.values._0_8_;
                  auVar87._8_56_ = auVar249;
                  auVar48 = vmovlhps_avx(auVar87._0_16_,auVar180._0_16_);
                  auVar249 = ZEXT856(auVar48._8_8_);
                  local_4b8._0_8_ = auVar48._0_8_;
                  local_4b8._8_4_ = auVar48._8_4_;
                  local_4b8._12_4_ = auVar48._12_4_;
                  SVar283 = FastExp((SampledSpectrum *)local_4b8);
                  auVar231._0_8_ = SVar283.values.values._8_8_;
                  auVar231._8_56_ = auVar152;
                  auVar88._0_8_ = SVar283.values.values._0_8_;
                  auVar88._8_56_ = auVar249;
                  auVar58 = auVar88._0_16_;
                }
              }
              else {
                this_00 = (Transform *)(this_01 + 3);
                if (((ulong)lightRay.medium.
                            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                            .bits & 0xfffe000000000000) == 0x2000000000000) {
                  sigma_a_3.values.values._8_8_ = &lightPathPDF;
                  sigma_a_3.values.values._0_8_ = &T_ray;
                  local_398.d.super_Tuple3<pbrt::Vector3,_float>.y = fVar267;
                  local_398.medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits = MVar22.
                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                          .bits;
                  local_640 = FVar53;
                  local_398.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = uVar16;
                  local_398._20_8_ = uVar17;
                  local_398._8_8_ = uVar38;
                  SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
                  Transform::ApplyInverse(&local_558,this_00,&local_398,&local_640);
                  tVar51 = Length<float>(&local_558.d);
                  local_640 = tVar51 * local_640;
                  auVar249 = (undefined1  [56])0x0;
                  VVar279 = Normalize<float>(&local_558.d);
                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.z =
                       VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar72._0_8_ = VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar72._8_56_ = auVar249;
                  uVar151 = vmovlps_avx(auVar72._0_16_);
                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar151;
                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar151 >> 0x20)
                  ;
                  pvVar2 = &this_01->values;
                  bVar24 = Bounds3<float>::IntersectP
                                     ((Bounds3<float> *)pvVar2,&local_558.o,&local_558.d,local_640,
                                      &tMin,&tMax);
                  auVar278 = auVar277._4_12_;
                  auVar272 = auVar271._4_12_;
                  auVar259 = auVar258._4_12_;
                  if (bVar24) {
                    FVar53 = *(Float *)&this_01[2].values.nStored;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&(this_01->values).nStored,lambda
                                        );
                    auVar169._0_8_ = SVar283.values.values._8_8_;
                    auVar169._8_56_ = auVar152;
                    auVar73._0_8_ = SVar283.values.values._0_8_;
                    auVar73._8_56_ = auVar249;
                    auVar48 = vmovlhps_avx(auVar73._0_16_,auVar169._0_16_);
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)local_4b8,FVar53);
                    auVar170._0_8_ = SVar283.values.values._8_8_;
                    auVar170._8_56_ = auVar152;
                    auVar74._0_8_ = SVar283.values.values._0_8_;
                    auVar74._8_56_ = auVar249;
                    sigma_a.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar74._0_16_,auVar170._0_16_);
                    FVar53 = *(Float *)&this_01[2].values.nStored;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&this_01[1].values.nStored,lambda
                                        );
                    auVar171._0_8_ = SVar283.values.values._8_8_;
                    auVar171._8_56_ = auVar152;
                    auVar75._0_8_ = SVar283.values.values._0_8_;
                    auVar75._8_56_ = auVar249;
                    auVar48 = vmovlhps_avx(auVar75._0_16_,auVar171._0_16_);
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)local_4b8,FVar53);
                    auVar172._0_8_ = SVar283.values.values._8_8_;
                    auVar172._8_56_ = auVar152;
                    auVar76._0_8_ = SVar283.values.values._0_8_;
                    auVar76._8_56_ = auVar249;
                    sigma_s.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar76._0_16_,auVar172._0_16_);
                    auVar249 = ZEXT856(sigma_s.values.values._8_8_);
                    SVar283 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
                    auVar173._0_8_ = SVar283.values.values._8_8_;
                    auVar173._8_56_ = auVar152;
                    auVar77._0_8_ = SVar283.values.values._0_8_;
                    auVar77._8_56_ = auVar249;
                    sigma_t.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar77._0_16_,auVar173._0_16_);
                    auVar152 = ZEXT856(sigma_t.values.values._8_8_);
                    VVar279 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar2);
                    auVar248 = auVar173._4_60_;
                    auVar78._0_8_ = VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar78._8_56_ = auVar152;
                    local_638 = auVar78._0_16_;
                    VVar281 = Bounds3<float>::Offset((Bounds3<float> *)pvVar2,&local_558.o);
                    local_600._8_4_ = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar79._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar79._8_56_ = auVar152;
                    auVar251._4_4_ = local_558.d.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar251._0_4_ = local_558.d.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar251._8_8_ = 0;
                    local_600._0_8_ = vmovlps_avx(auVar79._0_16_);
                    auVar152 = (undefined1  [56])0x0;
                    auVar48 = vdivps_avx(auVar251,local_638);
                    uStack_5f0._4_4_ =
                         local_558.d.super_Tuple3<pbrt::Vector3,_float>.z /
                         VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                    uVar151 = vmovlps_avx(auVar48);
                    fStack_5f4 = (float)uVar151;
                    uStack_5f0._0_4_ = (float)((ulong)uVar151 >> 0x20);
                    local_5e8 = (RNG *)((ulong)local_5e8 & 0xffffffff00000000);
                    local_5e0.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                             )0;
                    PVar280 = Ray::operator()((Ray *)local_600,tMin);
                    auVar174._0_4_ = PVar280.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar174._4_60_ = auVar248;
                    auVar80._0_8_ = PVar280.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar80._8_56_ = auVar152;
                    piVar3 = &this_01[7].lambda_max;
                    iVar25 = this_01[7].lambda_min;
                    auVar252 = vmovshdup_avx(auVar80._0_16_);
                    auVar153 = ZEXT816(0) << 0x40;
                    pvVar2 = &this_01[7].values;
                    pDVar4 = this_01 + 7;
                    lVar42 = 0;
                    iVar37 = this_01[7].lambda_max;
                    local_638._0_8_ = pvVar2;
                    fVar52 = (float)iVar37;
                    auVar262._0_4_ = (float)(iVar37 + -1);
                    auVar262._4_12_ = auVar259;
                    auVar49 = ZEXT416((uint)(auVar252._0_4_ * fVar52));
                    auVar48 = vminss_avx(auVar262,auVar49);
                    uVar151 = vcmpss_avx512f(auVar49,auVar153,1);
                    fVar257 = (float)iVar25;
                    auVar258 = ZEXT1664(CONCAT124(auVar272,fVar257));
                    auVar269._0_4_ = (float)(iVar25 + -1);
                    auVar269._4_12_ = auVar272;
                    iVar36 = *(int *)&this_01[7].values.alloc.memoryResource;
                    iVar31 = (int)(float)((uint)!(bool)((byte)uVar151 & 1) * auVar48._0_4_);
                    auVar49 = ZEXT416((uint)(PVar280.super_Tuple3<pbrt::Point3,_float>.x * fVar257))
                    ;
                    auVar48 = vminss_avx(auVar269,auVar49);
                    uVar151 = vcmpss_avx512f(auVar49,auVar153,1);
                    fVar260 = (float)iVar36;
                    auVar275._0_4_ = (float)(iVar36 + -1);
                    auVar275._4_12_ = auVar278;
                    fVar267 = (float)((uint)!(bool)((byte)uVar151 & 1) * auVar48._0_4_);
                    auVar47._4_12_ = auVar48._4_12_;
                    auVar47._0_4_ = fVar267;
                    iVar36 = (int)fVar267;
                    auVar48 = vminss_avx(auVar275,ZEXT416((uint)(auVar174._0_4_ * fVar260)));
                    uVar151 = vcmpss_avx512f(ZEXT416((uint)(auVar174._0_4_ * fVar260)),auVar153,1);
                    iVar40 = (int)(float)((uint)!(bool)((byte)uVar151 & 1) * auVar48._0_4_);
                    auVar277 = ZEXT464((uint)tMin);
                    local_658._0_4_ = tMin;
                    while( true ) {
                      auVar271 = ZEXT1664(auVar47);
                      if (lVar42 == 3) break;
                      iVar41 = (int)lVar42;
                      if (iVar41 == 1) {
                        voxel[1] = iVar31;
                        piVar43 = voxelLimit + 1;
                        piVar44 = step + 1;
                        pFVar45 = deltaT + 1;
                        pfVar35 = nextCrossingT + 1;
                        pfVar33 = (float *)&uStack_5f0;
                        iVar34 = iVar31;
                      }
                      else {
                        pfVar33 = &fStack_5f4;
                        if (iVar41 == 0) {
                          voxel[lVar42] = iVar36;
                          piVar43 = voxelLimit;
                          piVar44 = step;
                          pFVar45 = deltaT;
                          pfVar35 = nextCrossingT;
                          iVar34 = iVar36;
                        }
                        else {
                          piVar43 = voxelLimit + 2;
                          piVar44 = step + 2;
                          pFVar45 = deltaT + 2;
                          pfVar35 = nextCrossingT + 2;
                          pfVar33 = (float *)((long)&uStack_5f0 + 4);
                          voxel[lVar42] = iVar40;
                          iVar34 = iVar40;
                        }
                      }
                      pfVar39 = &fStack_5f4;
                      if ((*pfVar33 == 0.0) && (!NAN(*pfVar33))) {
                        pfVar33 = pfVar39;
                        if ((iVar41 != 0) && (pfVar33 = (float *)&uStack_5f0, iVar41 != 1)) {
                          pfVar33 = (float *)((long)&uStack_5f0 + 4);
                        }
                        *pfVar33 = 0.0;
                      }
                      pfVar33 = pfVar39;
                      if ((iVar41 != 0) && (pfVar33 = (float *)&uStack_5f0, iVar41 != 1)) {
                        pfVar33 = (float *)((long)&uStack_5f0 + 4);
                      }
                      if (0.0 <= *pfVar33) {
                        pDVar32 = pDVar4;
                        fVar267 = fVar257;
                        fVar273 = PVar280.super_Tuple3<pbrt::Point3,_float>.x;
                        if ((iVar41 != 0) &&
                           (pfVar39 = (float *)&uStack_5f0,
                           pDVar32 = (DenselySampledSpectrum *)piVar3, fVar267 = fVar52,
                           fVar273 = auVar252._0_4_, iVar41 != 1)) {
                          pfVar39 = (float *)((long)&uStack_5f0 + 4);
                          pDVar32 = (DenselySampledSpectrum *)pvVar2;
                          fVar267 = fVar260;
                          fVar273 = auVar174._0_4_;
                        }
                        *piVar44 = 1;
                        fVar5 = *pfVar39;
                        fVar273 = ((float)(iVar34 + 1) / fVar267 - fVar273) / fVar5 + tMin;
                        auVar277 = ZEXT464((uint)fVar273);
                        *pfVar35 = fVar273;
                        *pFVar45 = 1.0 / (fVar5 * fVar267);
                        iVar41 = *(int *)&((polymorphic_allocator<float> *)&pDVar32->lambda_min)->
                                          memoryResource;
                      }
                      else {
                        auVar277 = ZEXT1664(auVar80._0_16_);
                        pDVar32 = pDVar4;
                        fVar267 = fVar257;
                        if (iVar41 != 0) {
                          pfVar39 = (float *)&uStack_5f0;
                          auVar277 = ZEXT1664(auVar252);
                          pDVar32 = (DenselySampledSpectrum *)piVar3;
                          fVar267 = fVar52;
                          if (iVar41 != 1) {
                            pfVar39 = (float *)((long)&uStack_5f0 + 4);
                            auVar277 = ZEXT1664(auVar174._0_16_);
                            pDVar32 = (DenselySampledSpectrum *)pvVar2;
                            fVar267 = fVar260;
                          }
                        }
                        fVar273 = *pfVar39;
                        *pfVar35 = ((float)iVar34 / fVar267 - auVar277._0_4_) / fVar273 + tMin;
                        iVar41 = *(int *)&((polymorphic_allocator<float> *)&pDVar32->lambda_min)->
                                          memoryResource;
                        *piVar44 = -1;
                        *pFVar45 = -1.0 / (fVar273 * (float)iVar41);
                        iVar41 = -1;
                      }
                      auVar47 = ZEXT416(0);
                      *piVar43 = iVar41;
                      lVar42 = lVar42 + 1;
                    }
                    while( true ) {
                      iVar36 = *(int *)(&DAT_0053dd60 +
                                       (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                              (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                              (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
                      fVar267 = nextCrossingT[iVar36];
                      auVar249 = (undefined1  [56])0x0;
                      auVar48 = vminss_avx(ZEXT416((uint)fVar267),ZEXT416((uint)tMax));
                      fVar52 = auVar48._0_4_;
                      auVar152 = (undefined1  [56])0x0;
                      SVar283 = SampledSpectrum::operator*
                                          (&sigma_t,this_01[6].values.ptr
                                                    [(long)((iVar37 * voxel[2] + voxel[1]) * iVar25)
                                                     + (long)voxel[0]]);
                      auVar202._0_8_ = SVar283.values.values._8_8_;
                      auVar202._8_56_ = auVar249;
                      auVar109._0_8_ = SVar283.values.values._0_8_;
                      auVar109._8_56_ = auVar152;
                      auVar256 = ZEXT1664(auVar109._0_16_);
                      sigma_maj.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar109._0_16_,auVar202._0_16_);
                      auVar152 = ZEXT856(sigma_maj.values.values._8_8_);
                      if ((SVar283.values.values[0] != 0.0) || (NAN(SVar283.values.values[0]))) {
                        while( true ) {
                          FVar53 = SampleExponential((Float)local_568._0_4_,auVar256._0_4_);
                          local_638._0_4_ = FVar53;
                          fVar257 = RNG::Uniform<float>(&rng);
                          auVar252 = auVar277._0_16_;
                          auVar48 = auVar271._0_16_;
                          local_568._0_4_ = fVar257;
                          auVar152 = (undefined1  [56])0x0;
                          fVar257 = (float)local_638._0_4_ + (float)local_658._0_4_;
                          auVar249 = (undefined1  [56])0x0;
                          if (fVar52 <= fVar257) break;
                          auVar152 = (undefined1  [56])0x0;
                          if (fVar257 < tMax) {
                            local_638._0_4_ = fVar257;
                            SVar283 = SampledSpectrum::operator-(&sigma_maj);
                            auVar206._0_8_ = SVar283.values.values._8_8_;
                            auVar206._8_56_ = auVar249;
                            auVar113._0_8_ = SVar283.values.values._0_8_;
                            auVar113._8_56_ = auVar152;
                            d.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar113._0_16_,auVar206._0_16_);
                            auVar152 = (undefined1  [56])0x0;
                            SVar283 = SampledSpectrum::operator*
                                                (&d,(float)local_638._0_4_ - (float)local_658._0_4_)
                            ;
                            auVar207._0_8_ = SVar283.values.values._8_8_;
                            auVar207._8_56_ = auVar249;
                            auVar114._0_8_ = SVar283.values.values._0_8_;
                            auVar114._8_56_ = auVar152;
                            auVar49 = vmovlhps_avx(auVar114._0_16_,auVar207._0_16_);
                            auVar152 = ZEXT856(auVar49._8_8_);
                            local_4b8._0_8_ = auVar49._0_8_;
                            local_4b8._8_4_ = auVar49._8_4_;
                            local_4b8._12_4_ = auVar49._12_4_;
                            SVar283 = FastExp((SampledSpectrum *)local_4b8);
                            auVar208._0_8_ = SVar283.values.values._8_8_;
                            auVar208._8_56_ = auVar249;
                            auVar115._0_8_ = SVar283.values.values._0_8_;
                            auVar115._8_56_ = auVar152;
                            Tmaj_1.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar115._0_16_,auVar208._0_16_);
                            auVar152 = (undefined1  [56])0x0;
                            PVar280 = Ray::operator()(&local_558,(Float)local_638._0_4_);
                            local_590.z = PVar280.super_Tuple3<pbrt::Point3,_float>.z;
                            auVar116._0_8_ = PVar280.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            auVar116._8_56_ = auVar152;
                            local_590._0_8_ = vmovlps_avx(auVar116._0_16_);
                            SVar283 = CloudMediumProvider::Density
                                                (*(CloudMediumProvider **)this_01,PVar280,lambda);
                            auVar209._0_8_ = SVar283.values.values._8_8_;
                            auVar209._8_56_ = auVar249;
                            auVar117._0_8_ = SVar283.values.values._0_8_;
                            auVar117._8_56_ = auVar152;
                            d.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar117._0_16_,auVar209._0_16_);
                            PVar280.super_Tuple3<pbrt::Point3,_float>.z = local_590.z;
                            PVar280.super_Tuple3<pbrt::Point3,_float>.x = local_590.x;
                            PVar280.super_Tuple3<pbrt::Point3,_float>.y = local_590.y;
                            auVar152 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                            uVar150 = 0;
                            SVar283 = CloudMediumProvider::Le
                                                (*(CloudMediumProvider **)this_01,PVar280,lambda);
                            auVar210._0_8_ = SVar283.values.values._8_8_;
                            auVar210._8_56_ = auVar152;
                            local_658._8_8_ = uVar150;
                            local_658._0_8_ = SVar283.values.values._0_8_;
                            SVar283 = SampledSpectrum::operator*(&sigma_a,&d);
                            auVar211._0_8_ = SVar283.values.values._8_8_;
                            auVar211._8_56_ = auVar152;
                            local_298 = auVar211._0_16_;
                            auVar152 = ZEXT856(auVar152._0_8_);
                            uVar151 = uVar150;
                            SVar284 = SampledSpectrum::operator*(&sigma_s,&d);
                            auVar212._0_8_ = SVar284.values.values._8_8_;
                            auVar212._8_56_ = auVar152;
                            local_2a8._8_8_ = uVar151;
                            local_2a8._0_8_ = SVar284.values.values._0_8_;
                            local_2b8 = auVar212._0_16_;
                            SampledSpectrum::operator*=(&Tmaj_1,&TmajAccum);
                            SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_4b8,1.0);
                            uVar38 = CONCAT44(local_4b8._12_4_,local_4b8._8_4_);
                            TmajAccum.values.values[2] = (float)local_4b8._8_4_;
                            TmajAccum.values.values[3] = (float)local_4b8._12_4_;
                            TmajAccum.values.values[0] = (float)local_4b8._0_4_;
                            TmajAccum.values.values[1] = (float)local_4b8._4_4_;
                            PVar282 = Transform::operator()(this_00,(Point3<float> *)&local_590);
                            fVar257 = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
                            local_2c8._8_8_ = uVar38;
                            local_2c8._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            VVar279 = Normalize<float>(&local_398.d);
                            pSVar20 = local_368;
                            auVar254._8_4_ = 0x80000000;
                            auVar254._0_8_ = 0x8000000080000000;
                            auVar254._12_4_ = 0x80000000;
                            auVar265._4_4_ = fVar257;
                            auVar265._0_4_ = fVar257;
                            auVar265._8_4_ = fVar257;
                            auVar265._12_4_ = fVar257;
                            local_440 = (SampledSpectrum)(SampledSpectrum)sigma_maj.values.values;
                            local_490 = ZEXT816(0);
                            auVar56._0_8_ =
                                 VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                 0x8000000080000000;
                            auVar56._8_8_ = uVar38 ^ auVar254._8_8_;
                            fStack_494 = -VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                            auVar49 = vpermilps_avx(local_2c8,0x50);
                            local_480 = 0.0;
                            local_4b8._0_8_ = auVar49._0_8_;
                            local_4b8._8_4_ = auVar49._8_4_;
                            local_4b8._12_4_ = auVar49._12_4_;
                            uVar151 = vmovlps_avx(auVar265);
                            local_4b8._16_4_ = (undefined4)uVar151;
                            local_4b8._20_4_ = (undefined4)((ulong)uVar151 >> 0x20);
                            local_4b8._24_4_ = local_398.time;
                            uVar151 = vmovlpd_avx(auVar56);
                            fStack_49c = (float)uVar151;
                            fStack_498 = (float)((ulong)uVar151 >> 0x20);
                            auVar60._16_16_ = local_2b8;
                            auVar60._0_16_ = auVar56;
                            local_478 = (MediumInterface *)0x0;
                            auVar157._16_16_ = local_298;
                            auVar157._0_16_ = auVar56;
                            auVar61 = vperm2f128_avx(auVar157,auVar60,0x31);
                            auVar158._8_8_ = uVar150;
                            auVar158._0_8_ = SVar283.values.values._0_8_;
                            auVar158._16_16_ = local_2a8;
                            _local_460 = vunpcklpd_avx(auVar158,auVar61);
                            local_430.values.values =
                                 (array<float,_4>)vunpcklpd_avx(local_658,auVar210._0_16_);
                            *(undefined8 *)(local_368->values).values = Tmaj_1.values.values._0_8_;
                            *(undefined8 *)((pSVar20->values).values + 2) =
                                 Tmaj_1.values.values._8_8_;
                            auVar258 = ZEXT1664(auVar49);
                            auVar271 = ZEXT1664(auVar48);
                            auVar277 = ZEXT1664(auVar252);
                            local_470.bits =
                                 (ulong)MVar23.
                                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                                        .bits | 0x3000000000000;
                            local_468.bits =
                                 (ulong)((long)&this_01[2].values.nStored + 4U) | 0x1000000000000;
                            bVar24 = SampleLd::anon_class_32_4_3820c045::operator()
                                               ((anon_class_32_4_3820c045 *)&sigma_a_3,
                                                (MediumSample *)local_4b8);
                            if (!bVar24) goto LAB_0041ac65;
                            fVar257 = (float)local_638._0_4_;
                          }
                          auVar256 = ZEXT464((uint)sigma_maj.values.values[0]);
                          local_658._0_4_ = fVar257;
                        }
                        SVar283 = SampledSpectrum::operator-(&sigma_maj);
                        auVar213._0_8_ = SVar283.values.values._8_8_;
                        auVar213._8_56_ = auVar249;
                        auVar118._0_8_ = SVar283.values.values._0_8_;
                        auVar118._8_56_ = auVar152;
                        d.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar118._0_16_,auVar213._0_16_);
                        auVar152 = (undefined1  [56])0x0;
                        SVar283 = SampledSpectrum::operator*(&d,fVar52 - (float)local_658._0_4_);
                        auVar214._0_8_ = SVar283.values.values._8_8_;
                        auVar214._8_56_ = auVar249;
                        auVar119._0_8_ = SVar283.values.values._0_8_;
                        auVar119._8_56_ = auVar152;
                        Tmaj_1.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar119._0_16_,auVar214._0_16_);
                        auVar152 = ZEXT856(Tmaj_1.values.values._8_8_);
                        SVar283 = FastExp(&Tmaj_1);
                        auVar215._0_8_ = SVar283.values.values._8_8_;
                        auVar215._8_56_ = auVar249;
                        auVar252 = auVar215._0_16_;
                        auVar120._0_8_ = SVar283.values.values._0_8_;
                        auVar120._8_56_ = auVar152;
                        auVar48 = auVar120._0_16_;
                      }
                      else {
                        SVar283 = SampledSpectrum::operator-(&sigma_maj);
                        auVar203._0_8_ = SVar283.values.values._8_8_;
                        auVar203._8_56_ = auVar249;
                        auVar110._0_8_ = SVar283.values.values._0_8_;
                        auVar110._8_56_ = auVar152;
                        d.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar110._0_16_,auVar203._0_16_);
                        auVar152 = (undefined1  [56])0x0;
                        SVar283 = SampledSpectrum::operator*(&d,fVar52 - (float)local_658._0_4_);
                        auVar204._0_8_ = SVar283.values.values._8_8_;
                        auVar204._8_56_ = auVar249;
                        auVar111._0_8_ = SVar283.values.values._0_8_;
                        auVar111._8_56_ = auVar152;
                        Tmaj_1.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar111._0_16_,auVar204._0_16_);
                        auVar152 = ZEXT856(Tmaj_1.values.values._8_8_);
                        SVar283 = FastExp(&Tmaj_1);
                        auVar205._0_8_ = SVar283.values.values._8_8_;
                        auVar205._8_56_ = auVar249;
                        auVar252 = auVar205._0_16_;
                        auVar112._0_8_ = SVar283.values.values._0_8_;
                        auVar112._8_56_ = auVar152;
                        auVar48 = auVar112._0_16_;
                      }
                      auVar48 = vmovlhps_avx(auVar48,auVar252);
                      local_4b8._0_8_ = auVar48._0_8_;
                      local_4b8._8_4_ = auVar48._8_4_;
                      local_4b8._12_4_ = auVar48._12_4_;
                      SampledSpectrum::operator*=(&TmajAccum,(SampledSpectrum *)local_4b8);
                      if ((tMax < fVar267) ||
                         (iVar25 = voxel[iVar36], voxel[iVar36] = iVar25 + step[iVar36],
                         iVar25 + step[iVar36] == voxelLimit[iVar36])) break;
                      local_658._0_4_ = fVar52;
                      nextCrossingT[iVar36] = fVar267 + deltaT[iVar36];
                      iVar25 = *(int *)&((polymorphic_allocator<float> *)&pDVar4->lambda_min)->
                                        memoryResource;
                      iVar37 = *piVar3;
                    }
LAB_0041ac65:
                    SVar283.values.values = TmajAccum.values.values;
                    local_4b8._0_4_ = TmajAccum.values.values[0];
                    local_4b8._4_4_ = TmajAccum.values.values[1];
                    local_4b8._8_8_ = SVar283.values.values._8_8_;
                    TmajAccum.values.values = SVar283.values.values;
                  }
                  else {
                    SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_4b8,1.0);
                  }
                }
                else {
                  sigma_a_3.values.values._8_8_ = &lightPathPDF;
                  sigma_a_3.values.values._0_8_ = &T_ray;
                  local_398.d.super_Tuple3<pbrt::Vector3,_float>.y = fVar267;
                  local_398.medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits = MVar22.
                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                          .bits;
                  local_640 = FVar53;
                  local_398.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = uVar16;
                  local_398._20_8_ = uVar17;
                  local_398._8_8_ = uVar38;
                  SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
                  Transform::ApplyInverse(&local_558,this_00,&local_398,&local_640);
                  tVar51 = Length<float>(&local_558.d);
                  local_640 = tVar51 * local_640;
                  auVar249 = (undefined1  [56])0x0;
                  VVar279 = Normalize<float>(&local_558.d);
                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.z =
                       VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar89._0_8_ = VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar89._8_56_ = auVar249;
                  uVar151 = vmovlps_avx(auVar89._0_16_);
                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar151;
                  local_558.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar151 >> 0x20)
                  ;
                  pvVar2 = &this_01->values;
                  bVar24 = Bounds3<float>::IntersectP
                                     ((Bounds3<float> *)pvVar2,&local_558.o,&local_558.d,local_640,
                                      &tMin,&tMax);
                  auVar272 = auVar277._4_12_;
                  auVar259 = auVar258._4_12_;
                  if (bVar24) {
                    FVar53 = *(Float *)&this_01[2].values.nStored;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&(this_01->values).nStored,lambda
                                        );
                    auVar181._0_8_ = SVar283.values.values._8_8_;
                    auVar181._8_56_ = auVar152;
                    auVar277._0_8_ = SVar283.values.values._0_8_;
                    auVar277._8_56_ = auVar249;
                    auVar48 = vmovlhps_avx(auVar277._0_16_,auVar181._0_16_);
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)local_4b8,FVar53);
                    auVar182._0_8_ = SVar283.values.values._8_8_;
                    auVar182._8_56_ = auVar152;
                    auVar90._0_8_ = SVar283.values.values._0_8_;
                    auVar90._8_56_ = auVar249;
                    sigma_a.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar90._0_16_,auVar182._0_16_);
                    FVar53 = *(Float *)&this_01[2].values.nStored;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = DenselySampledSpectrum::Sample
                                        ((DenselySampledSpectrum *)&this_01[1].values.nStored,lambda
                                        );
                    auVar183._0_8_ = SVar283.values.values._8_8_;
                    auVar183._8_56_ = auVar152;
                    auVar91._0_8_ = SVar283.values.values._0_8_;
                    auVar91._8_56_ = auVar249;
                    auVar48 = vmovlhps_avx(auVar91._0_16_,auVar183._0_16_);
                    local_4b8._0_8_ = auVar48._0_8_;
                    local_4b8._8_4_ = auVar48._8_4_;
                    local_4b8._12_4_ = auVar48._12_4_;
                    auVar249 = (undefined1  [56])0x0;
                    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)local_4b8,FVar53);
                    auVar184._0_8_ = SVar283.values.values._8_8_;
                    auVar184._8_56_ = auVar152;
                    auVar92._0_8_ = SVar283.values.values._0_8_;
                    auVar92._8_56_ = auVar249;
                    sigma_s.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar92._0_16_,auVar184._0_16_);
                    auVar249 = ZEXT856(sigma_s.values.values._8_8_);
                    SVar283 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
                    auVar185._0_8_ = SVar283.values.values._8_8_;
                    auVar185._8_56_ = auVar152;
                    auVar93._0_8_ = SVar283.values.values._0_8_;
                    auVar93._8_56_ = auVar249;
                    sigma_t.values.values =
                         (array<float,_4>)vmovlhps_avx(auVar93._0_16_,auVar185._0_16_);
                    auVar152 = ZEXT856(sigma_t.values.values._8_8_);
                    VVar279 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar2);
                    auVar248 = auVar185._4_60_;
                    auVar94._0_8_ = VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar94._8_56_ = auVar152;
                    local_638 = auVar94._0_16_;
                    VVar281 = Bounds3<float>::Offset((Bounds3<float> *)pvVar2,&local_558.o);
                    local_600._8_4_ = VVar281.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar95._0_8_ = VVar281.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar95._8_56_ = auVar152;
                    auVar252._4_4_ = local_558.d.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar252._0_4_ = local_558.d.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar252._8_8_ = 0;
                    local_600._0_8_ = vmovlps_avx(auVar95._0_16_);
                    auVar152 = (undefined1  [56])0x0;
                    auVar48 = vdivps_avx(auVar252,local_638);
                    uStack_5f0._4_4_ =
                         local_558.d.super_Tuple3<pbrt::Vector3,_float>.z /
                         VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                    uVar151 = vmovlps_avx(auVar48);
                    fStack_5f4 = (float)uVar151;
                    uStack_5f0._0_4_ = (float)((ulong)uVar151 >> 0x20);
                    local_5e8 = (RNG *)((ulong)local_5e8 & 0xffffffff00000000);
                    local_5e0.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                             )0;
                    PVar280 = Ray::operator()((Ray *)local_600,tMin);
                    auVar186._0_4_ = PVar280.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar186._4_60_ = auVar248;
                    auVar96._0_8_ = PVar280.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar96._8_56_ = auVar152;
                    pDVar4 = this_01 + 7;
                    piVar3 = &this_01[7].lambda_max;
                    auVar252 = vmovshdup_avx(auVar96._0_16_);
                    auVar153 = ZEXT816(0) << 0x40;
                    lVar42 = 0;
                    iVar25 = this_01[7].lambda_max;
                    uVar8 = this_01[7].lambda_min;
                    uVar38 = CONCAT44(0,uVar8);
                    fVar52 = (float)iVar25;
                    local_638._0_8_ = uVar38;
                    auVar263._0_4_ = (float)(iVar25 + -1);
                    auVar263._4_12_ = auVar259;
                    auVar270._0_4_ = (float)(int)(uVar8 - 1);
                    auVar270._4_12_ = auVar259;
                    iVar37 = *(int *)&this_01[7].values.alloc.memoryResource;
                    auVar49 = ZEXT416((uint)(auVar252._0_4_ * fVar52));
                    auVar48 = vminss_avx(auVar263,auVar49);
                    uVar151 = vcmpss_avx512f(auVar49,auVar153,1);
                    fVar257 = (float)(int)uVar8;
                    auVar258 = ZEXT1664(CONCAT124(auVar272,fVar257));
                    iVar36 = (int)(float)((uint)!(bool)((byte)uVar151 & 1) * auVar48._0_4_);
                    auVar49 = ZEXT416((uint)(PVar280.super_Tuple3<pbrt::Point3,_float>.x * fVar257))
                    ;
                    auVar48 = vminss_avx(auVar270,auVar49);
                    uVar151 = vcmpss_avx512f(auVar49,auVar153,1);
                    fVar260 = (float)iVar37;
                    auVar276._0_4_ = (float)(iVar37 + -1);
                    auVar276._4_12_ = auVar272;
                    fVar267 = (float)((uint)!(bool)((byte)uVar151 & 1) * auVar48._0_4_);
                    auVar49._4_12_ = auVar48._4_12_;
                    auVar49._0_4_ = fVar267;
                    iVar37 = (int)fVar267;
                    auVar48 = vminss_avx(auVar276,ZEXT416((uint)(auVar186._0_4_ * fVar260)));
                    uVar151 = vcmpss_avx512f(ZEXT416((uint)(auVar186._0_4_ * fVar260)),auVar153,1);
                    iVar31 = (int)(float)((uint)!(bool)((byte)uVar151 & 1) * auVar48._0_4_);
                    auVar277 = ZEXT464((uint)tMin);
                    local_658._0_4_ = tMin;
                    while( true ) {
                      auVar271 = ZEXT1664(auVar49);
                      if (lVar42 == 3) break;
                      iVar40 = (int)lVar42;
                      if (iVar40 == 1) {
                        voxel[1] = iVar36;
                        piVar43 = voxelLimit + 1;
                        piVar44 = step + 1;
                        pFVar45 = deltaT + 1;
                        pfVar35 = nextCrossingT + 1;
                        pfVar33 = (float *)&uStack_5f0;
                        iVar41 = iVar36;
                      }
                      else if (iVar40 == 0) {
                        voxel[lVar42] = iVar37;
                        piVar43 = voxelLimit;
                        piVar44 = step;
                        pFVar45 = deltaT;
                        pfVar35 = nextCrossingT;
                        pfVar33 = &fStack_5f4;
                        iVar41 = iVar37;
                      }
                      else {
                        piVar43 = voxelLimit + 2;
                        piVar44 = step + 2;
                        pFVar45 = deltaT + 2;
                        pfVar35 = nextCrossingT + 2;
                        pfVar33 = (float *)((long)&uStack_5f0 + 4);
                        voxel[lVar42] = iVar31;
                        iVar41 = iVar31;
                      }
                      if ((*pfVar33 == 0.0) && (!NAN(*pfVar33))) {
                        pfVar33 = &fStack_5f4;
                        if ((iVar40 != 0) && (pfVar33 = (float *)&uStack_5f0, iVar40 != 1)) {
                          pfVar33 = (float *)((long)&uStack_5f0 + 4);
                        }
                        *pfVar33 = 0.0;
                      }
                      pfVar33 = &fStack_5f4;
                      if ((iVar40 != 0) && (pfVar33 = (float *)&uStack_5f0, iVar40 != 1)) {
                        pfVar33 = (float *)((long)&uStack_5f0 + 4);
                      }
                      if (0.0 <= *pfVar33) {
                        pfVar33 = &fStack_5f4;
                        pDVar32 = pDVar4;
                        fVar267 = fVar257;
                        fVar273 = PVar280.super_Tuple3<pbrt::Point3,_float>.x;
                        if ((iVar40 != 0) &&
                           (pfVar33 = (float *)&uStack_5f0,
                           pDVar32 = (DenselySampledSpectrum *)piVar3, fVar267 = fVar52,
                           fVar273 = auVar252._0_4_, iVar40 != 1)) {
                          pfVar33 = (float *)((long)&uStack_5f0 + 4);
                          pDVar32 = (DenselySampledSpectrum *)&this_01[7].values;
                          fVar267 = fVar260;
                          fVar273 = auVar186._0_4_;
                        }
                        *piVar44 = 1;
                        fVar5 = *pfVar33;
                        fVar273 = ((float)(iVar41 + 1) / fVar267 - fVar273) / fVar5 + tMin;
                        auVar277 = ZEXT464((uint)fVar273);
                        *pfVar35 = fVar273;
                        *pFVar45 = 1.0 / (fVar5 * fVar267);
                        iVar40 = pDVar32->lambda_min;
                      }
                      else {
                        pfVar33 = &fStack_5f4;
                        auVar277 = ZEXT1664(auVar96._0_16_);
                        pDVar32 = pDVar4;
                        fVar267 = fVar257;
                        if (iVar40 != 0) {
                          pfVar33 = (float *)&uStack_5f0;
                          auVar277 = ZEXT1664(auVar252);
                          pDVar32 = (DenselySampledSpectrum *)piVar3;
                          fVar267 = fVar52;
                          if (iVar40 != 1) {
                            pfVar33 = (float *)((long)&uStack_5f0 + 4);
                            auVar277 = ZEXT1664(auVar186._0_16_);
                            pDVar32 = (DenselySampledSpectrum *)&this_01[7].values;
                            fVar267 = fVar260;
                          }
                        }
                        fVar273 = *pfVar33;
                        *pfVar35 = ((float)iVar41 / fVar267 - auVar277._0_4_) / fVar273 + tMin;
                        iVar40 = pDVar32->lambda_min;
                        *piVar44 = -1;
                        *pFVar45 = -1.0 / (fVar273 * (float)iVar40);
                        iVar40 = -1;
                      }
                      auVar49 = ZEXT416(0);
                      *piVar43 = iVar40;
                      lVar42 = lVar42 + 1;
                    }
                    while( true ) {
                      iVar37 = *(int *)(&DAT_0053dd60 +
                                       (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                              (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                              (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
                      fVar267 = nextCrossingT[iVar37];
                      auVar249 = (undefined1  [56])0x0;
                      auVar48 = vminss_avx(ZEXT416((uint)fVar267),ZEXT416((uint)tMax));
                      fVar52 = auVar48._0_4_;
                      auVar152 = (undefined1  [56])0x0;
                      SVar283 = SampledSpectrum::operator*
                                          (&sigma_t,this_01[6].values.ptr
                                                    [(long)((iVar25 * voxel[2] + voxel[1]) *
                                                           (int)uVar38) + (long)voxel[0]]);
                      auVar216._0_8_ = SVar283.values.values._8_8_;
                      auVar216._8_56_ = auVar249;
                      auVar121._0_8_ = SVar283.values.values._0_8_;
                      auVar121._8_56_ = auVar152;
                      auVar256 = ZEXT1664(auVar121._0_16_);
                      sigma_maj.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar121._0_16_,auVar216._0_16_);
                      auVar152 = ZEXT856(sigma_maj.values.values._8_8_);
                      if ((SVar283.values.values[0] != 0.0) || (NAN(SVar283.values.values[0]))) {
                        while( true ) {
                          FVar53 = SampleExponential((Float)local_568._0_4_,auVar256._0_4_);
                          local_638._0_4_ = FVar53;
                          fVar257 = RNG::Uniform<float>(&rng);
                          auVar252 = auVar277._0_16_;
                          auVar48 = auVar271._0_16_;
                          local_568._0_4_ = fVar257;
                          auVar152 = (undefined1  [56])0x0;
                          fVar257 = (float)local_638._0_4_ + (float)local_658._0_4_;
                          auVar249 = (undefined1  [56])0x0;
                          if (fVar52 <= fVar257) break;
                          auVar152 = (undefined1  [56])0x0;
                          if (fVar257 < tMax) {
                            local_638._0_4_ = fVar257;
                            SVar283 = SampledSpectrum::operator-(&sigma_maj);
                            auVar220._0_8_ = SVar283.values.values._8_8_;
                            auVar220._8_56_ = auVar249;
                            auVar125._0_8_ = SVar283.values.values._0_8_;
                            auVar125._8_56_ = auVar152;
                            d.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar125._0_16_,auVar220._0_16_);
                            auVar152 = (undefined1  [56])0x0;
                            SVar283 = SampledSpectrum::operator*
                                                (&d,(float)local_638._0_4_ - (float)local_658._0_4_)
                            ;
                            auVar221._0_8_ = SVar283.values.values._8_8_;
                            auVar221._8_56_ = auVar249;
                            auVar126._0_8_ = SVar283.values.values._0_8_;
                            auVar126._8_56_ = auVar152;
                            auVar49 = vmovlhps_avx(auVar126._0_16_,auVar221._0_16_);
                            auVar152 = ZEXT856(auVar49._8_8_);
                            local_4b8._0_8_ = auVar49._0_8_;
                            local_4b8._8_4_ = auVar49._8_4_;
                            local_4b8._12_4_ = auVar49._12_4_;
                            SVar283 = FastExp((SampledSpectrum *)local_4b8);
                            auVar222._0_8_ = SVar283.values.values._8_8_;
                            auVar222._8_56_ = auVar249;
                            auVar127._0_8_ = SVar283.values.values._0_8_;
                            auVar127._8_56_ = auVar152;
                            Tmaj_1.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar127._0_16_,auVar222._0_16_);
                            auVar152 = (undefined1  [56])0x0;
                            PVar280 = Ray::operator()(&local_558,(Float)local_638._0_4_);
                            local_590.z = PVar280.super_Tuple3<pbrt::Point3,_float>.z;
                            auVar128._0_8_ = PVar280.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            auVar128._8_56_ = auVar152;
                            local_590._0_8_ = vmovlps_avx(auVar128._0_16_);
                            SVar283 = NanoVDBMediumProvider::Density
                                                (*(NanoVDBMediumProvider **)this_01,
                                                 (Point3f *)&local_590,lambda);
                            auVar223._0_8_ = SVar283.values.values._8_8_;
                            auVar223._8_56_ = auVar249;
                            auVar129._0_8_ = SVar283.values.values._0_8_;
                            auVar129._8_56_ = auVar152;
                            d.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar129._0_16_,auVar223._0_16_);
                            uVar150 = d.values.values._8_8_;
                            SVar283 = NanoVDBMediumProvider::Le
                                                (*(NanoVDBMediumProvider **)this_01,
                                                 (Point3f *)&local_590,lambda);
                            auVar224._0_8_ = SVar283.values.values._8_8_;
                            auVar224._8_56_ = auVar249;
                            local_658._8_8_ = uVar150;
                            local_658._0_8_ = SVar283.values.values._0_8_;
                            SVar283 = SampledSpectrum::operator*(&sigma_a,&d);
                            auVar225._0_8_ = SVar283.values.values._8_8_;
                            auVar225._8_56_ = auVar249;
                            uStack_200 = auVar249._0_8_;
                            auVar152 = ZEXT856(uStack_200);
                            uVar151 = uVar150;
                            SVar284 = SampledSpectrum::operator*(&sigma_s,&d);
                            auVar226._0_8_ = SVar284.values.values._8_8_;
                            auVar226._8_56_ = auVar152;
                            local_298._8_8_ = uVar151;
                            local_298._0_8_ = SVar284.values.values._0_8_;
                            local_2a8 = auVar226._0_16_;
                            SampledSpectrum::operator*=(&Tmaj_1,&TmajAccum);
                            auVar248 = auVar226._4_60_;
                            SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_4b8,1.0);
                            uVar151 = CONCAT44(local_4b8._12_4_,local_4b8._8_4_);
                            TmajAccum.values.values[2] = (float)local_4b8._8_4_;
                            TmajAccum.values.values[3] = (float)local_4b8._12_4_;
                            TmajAccum.values.values[0] = (float)local_4b8._0_4_;
                            TmajAccum.values.values[1] = (float)local_4b8._4_4_;
                            PVar282 = Transform::operator()(this_00,(Point3<float> *)&local_590);
                            auVar227._0_4_ = PVar282.super_Tuple3<pbrt::Point3,_float>.z;
                            auVar227._4_60_ = auVar248;
                            local_2b8._8_8_ = uVar151;
                            local_2b8._0_8_ = PVar282.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            local_2c8 = auVar227._0_16_;
                            VVar279 = Normalize<float>(&local_398.d);
                            pSVar20 = local_368;
                            auVar266._4_4_ = local_2c8._0_4_;
                            auVar266._0_4_ = local_2c8._0_4_;
                            auVar266._8_4_ = local_2c8._0_4_;
                            auVar266._12_4_ = local_2c8._0_4_;
                            local_440 = (SampledSpectrum)(SampledSpectrum)sigma_maj.values.values;
                            local_490 = ZEXT816(0);
                            auVar57._0_8_ =
                                 VVar279.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                 0x8000000080000000;
                            auVar57._8_4_ = (uint)uVar151 ^ 0x80000000;
                            auVar57._12_4_ = (uint)((ulong)uVar151 >> 0x20) ^ 0x80000000;
                            fStack_494 = -VVar279.super_Tuple3<pbrt::Vector3,_float>.z;
                            auVar49 = vpermilps_avx(local_2b8,0x50);
                            local_480 = 0.0;
                            local_4b8._0_8_ = auVar49._0_8_;
                            local_4b8._8_4_ = auVar49._8_4_;
                            local_4b8._12_4_ = auVar49._12_4_;
                            uVar151 = vmovlps_avx(auVar266);
                            local_4b8._16_4_ = (undefined4)uVar151;
                            local_4b8._20_4_ = (undefined4)((ulong)uVar151 >> 0x20);
                            local_4b8._24_4_ = local_398.time;
                            uVar151 = vmovlps_avx(auVar57);
                            fStack_49c = (float)uVar151;
                            fStack_498 = (float)((ulong)uVar151 >> 0x20);
                            auVar61._16_16_ = local_2a8;
                            auVar61._0_16_ = auVar57;
                            local_478 = (MediumInterface *)0x0;
                            auVar159._16_16_ = auVar225._0_16_;
                            auVar159._0_16_ = auVar57;
                            auVar61 = vperm2f128_avx(auVar159,auVar61,0x31);
                            auVar160._8_8_ = uVar150;
                            auVar160._0_8_ = SVar283.values.values._0_8_;
                            auVar160._16_16_ = local_298;
                            _local_460 = vunpcklpd_avx(auVar160,auVar61);
                            local_430.values.values =
                                 (array<float,_4>)vunpcklpd_avx(local_658,auVar224._0_16_);
                            *(undefined8 *)(local_368->values).values = Tmaj_1.values.values._0_8_;
                            *(undefined8 *)((pSVar20->values).values + 2) =
                                 Tmaj_1.values.values._8_8_;
                            auVar258 = ZEXT1664(auVar49);
                            auVar271 = ZEXT1664(auVar48);
                            auVar277 = ZEXT1664(auVar252);
                            local_470.bits = (ulong)this_01 | 0x4000000000000;
                            local_468.bits =
                                 (ulong)((long)&this_01[2].values.nStored + 4U) | 0x1000000000000;
                            bVar24 = SampleLd::anon_class_32_4_3820c045::operator()
                                               ((anon_class_32_4_3820c045 *)&sigma_a_3,
                                                (MediumSample *)local_4b8);
                            if (!bVar24) goto LAB_0041ac65;
                            fVar257 = (float)local_638._0_4_;
                          }
                          auVar256 = ZEXT464((uint)sigma_maj.values.values[0]);
                          local_658._0_4_ = fVar257;
                        }
                        SVar283 = SampledSpectrum::operator-(&sigma_maj);
                        auVar228._0_8_ = SVar283.values.values._8_8_;
                        auVar228._8_56_ = auVar249;
                        auVar130._0_8_ = SVar283.values.values._0_8_;
                        auVar130._8_56_ = auVar152;
                        d.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar130._0_16_,auVar228._0_16_);
                        auVar152 = (undefined1  [56])0x0;
                        SVar283 = SampledSpectrum::operator*(&d,fVar52 - (float)local_658._0_4_);
                        auVar229._0_8_ = SVar283.values.values._8_8_;
                        auVar229._8_56_ = auVar249;
                        auVar131._0_8_ = SVar283.values.values._0_8_;
                        auVar131._8_56_ = auVar152;
                        Tmaj_1.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar131._0_16_,auVar229._0_16_);
                        auVar152 = ZEXT856(Tmaj_1.values.values._8_8_);
                        SVar283 = FastExp(&Tmaj_1);
                        auVar230._0_8_ = SVar283.values.values._8_8_;
                        auVar230._8_56_ = auVar249;
                        auVar252 = auVar230._0_16_;
                        auVar132._0_8_ = SVar283.values.values._0_8_;
                        auVar132._8_56_ = auVar152;
                        auVar48 = auVar132._0_16_;
                      }
                      else {
                        SVar283 = SampledSpectrum::operator-(&sigma_maj);
                        auVar217._0_8_ = SVar283.values.values._8_8_;
                        auVar217._8_56_ = auVar249;
                        auVar122._0_8_ = SVar283.values.values._0_8_;
                        auVar122._8_56_ = auVar152;
                        d.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar122._0_16_,auVar217._0_16_);
                        auVar152 = (undefined1  [56])0x0;
                        SVar283 = SampledSpectrum::operator*(&d,fVar52 - (float)local_658._0_4_);
                        auVar218._0_8_ = SVar283.values.values._8_8_;
                        auVar218._8_56_ = auVar249;
                        auVar123._0_8_ = SVar283.values.values._0_8_;
                        auVar123._8_56_ = auVar152;
                        Tmaj_1.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar123._0_16_,auVar218._0_16_);
                        auVar152 = ZEXT856(Tmaj_1.values.values._8_8_);
                        SVar283 = FastExp(&Tmaj_1);
                        auVar219._0_8_ = SVar283.values.values._8_8_;
                        auVar219._8_56_ = auVar249;
                        auVar252 = auVar219._0_16_;
                        auVar124._0_8_ = SVar283.values.values._0_8_;
                        auVar124._8_56_ = auVar152;
                        auVar48 = auVar124._0_16_;
                      }
                      auVar48 = vmovlhps_avx(auVar48,auVar252);
                      local_4b8._0_8_ = auVar48._0_8_;
                      local_4b8._8_4_ = auVar48._8_4_;
                      local_4b8._12_4_ = auVar48._12_4_;
                      SampledSpectrum::operator*=(&TmajAccum,(SampledSpectrum *)local_4b8);
                      if ((tMax < fVar267) ||
                         (iVar25 = voxel[iVar37], voxel[iVar37] = iVar25 + step[iVar37],
                         iVar25 + step[iVar37] == voxelLimit[iVar37])) break;
                      nextCrossingT[iVar37] = fVar267 + deltaT[iVar37];
                      uVar38 = (ulong)(uint)pDVar4->lambda_min;
                      iVar25 = *piVar3;
                      local_658._0_4_ = fVar52;
                    }
                    goto LAB_0041ac65;
                  }
                  SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_4b8,1.0);
                }
LAB_0041ac77:
                auVar58._8_8_ = 0;
                auVar58._0_8_ = local_4b8._0_8_;
                auVar231 = ZEXT864((ulong)local_4b8._8_8_);
              }
              auVar152 = auVar231._8_56_;
              Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar58,auVar231._0_16_);
              SampledSpectrum::operator*=(&T_ray,&Tmaj);
              SampledSpectrum::operator*=(&lightPathPDF,&Tmaj);
              SampledSpectrum::operator*=(&uniPathPDF,&Tmaj);
            }
            bVar24 = SampledSpectrum::operator_cast_to_bool(&T_ray);
            if (!bVar24) goto LAB_0041afc5;
            if (si.set == false) goto LAB_0041afe8;
            pSVar30 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
            pLVar28 = pstd::optional<pbrt::LightLiSample>::value(&ls);
            Interaction::SpawnRayTo((Ray *)local_4b8,(Interaction *)pSVar30,&pLVar28->pLight);
            lightRay.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits._4_4_ = fStack_494;
            lightRay.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits._0_4_ = fStack_498;
            lightRay.time = (Float)local_4b8._24_4_;
            lightRay.o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_4b8._0_8_;
            lightRay.o.super_Tuple3<pbrt::Point3,_float>.y = SUB84(local_4b8._0_8_,4);
            lightRay._8_8_ = local_4b8._8_8_;
            lightRay.d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = local_4b8._16_8_;
            pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
          } while( true );
        }
        SampledSpectrum::SampledSpectrum(&local_360,0.0);
        goto LAB_004186ec;
      }
    }
  }
  SampledSpectrum::SampledSpectrum(&local_360,0.0);
  goto LAB_004186ec;
LAB_0041afe8:
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
LAB_0041aff5:
  auVar249 = (undefined1  [56])0x0;
  SVar283 = SampledSpectrum::operator*(pathPDF,local_34c);
  auVar237._0_8_ = SVar283.values.values._8_8_;
  auVar237._8_56_ = auVar152;
  auVar139._0_8_ = SVar283.values.values._0_8_;
  auVar139._8_56_ = auVar249;
  si.optionalValue._0_16_ = vmovlhps_avx(auVar139._0_16_,auVar237._0_16_);
  SampledSpectrum::operator*=(&lightPathPDF,(SampledSpectrum *)&si);
  auVar249 = (undefined1  [56])0x0;
  SVar283 = SampledSpectrum::operator*(pathPDF,FVar50);
  auVar238._0_8_ = SVar283.values.values._8_8_;
  auVar238._8_56_ = auVar152;
  auVar140._0_8_ = SVar283.values.values._0_8_;
  auVar140._8_56_ = auVar249;
  si.optionalValue._0_16_ = vmovlhps_avx(auVar140._0_16_,auVar238._0_16_);
  auVar249 = ZEXT856(si.optionalValue._8_8_);
  SampledSpectrum::operator*=(&uniPathPDF,(SampledSpectrum *)&si);
  if (*(uint *)((ulong)local_270 & 0xffffffffffff) < 2) {
    SVar283 = SampledSpectrum::operator*(T_hat,&local_288);
    auVar239._0_8_ = SVar283.values.values._8_8_;
    auVar239._8_56_ = auVar152;
    auVar141._0_8_ = SVar283.values.values._0_8_;
    auVar141._8_56_ = auVar249;
    auVar48 = vmovlhps_avx(auVar141._0_16_,auVar239._0_16_);
    auVar249 = ZEXT856(auVar48._8_8_);
    local_558.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar48._0_8_;
    local_558.o.super_Tuple3<pbrt::Point3,_float>.z = auVar48._8_4_;
    local_558.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar48._12_4_;
    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)&local_558,&T_ray);
    auVar240._0_8_ = SVar283.values.values._8_8_;
    auVar240._8_56_ = auVar152;
    auVar142._0_8_ = SVar283.values.values._0_8_;
    auVar142._8_56_ = auVar249;
    auVar48 = vmovlhps_avx(auVar142._0_16_,auVar240._0_16_);
    auVar249 = ZEXT856(auVar48._8_8_);
    local_4b8._0_8_ = auVar48._0_8_;
    local_4b8._8_4_ = auVar48._8_4_;
    local_4b8._12_4_ = auVar48._12_4_;
    pLVar28 = pstd::optional<pbrt::LightLiSample>::value(&ls);
    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)local_4b8,&pLVar28->L);
    auVar241._0_8_ = SVar283.values.values._8_8_;
    auVar241._8_56_ = auVar152;
    auVar143._0_8_ = SVar283.values.values._0_8_;
    auVar143._8_56_ = auVar249;
    si.optionalValue._0_16_ = vmovlhps_avx(auVar143._0_16_,auVar241._0_16_);
    FVar50 = SampledSpectrum::Average(&lightPathPDF);
    auVar249 = extraout_var_01;
    SVar283 = SampledSpectrum::operator/((SampledSpectrum *)&si,FVar50);
    auVar242._0_8_ = SVar283.values.values._8_8_;
    auVar242._8_56_ = auVar152;
    auVar252 = auVar242._0_16_;
    auVar144._0_8_ = SVar283.values.values._0_8_;
    auVar144._8_56_ = auVar249;
    auVar48 = auVar144._0_16_;
  }
  else {
    SVar283 = SampledSpectrum::operator*(T_hat,&local_288);
    auVar243._0_8_ = SVar283.values.values._8_8_;
    auVar243._8_56_ = auVar152;
    auVar145._0_8_ = SVar283.values.values._0_8_;
    auVar145._8_56_ = auVar249;
    auVar48 = vmovlhps_avx(auVar145._0_16_,auVar243._0_16_);
    auVar249 = ZEXT856(auVar48._8_8_);
    local_558.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar48._0_8_;
    local_558.o.super_Tuple3<pbrt::Point3,_float>.z = auVar48._8_4_;
    local_558.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar48._12_4_;
    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)&local_558,&T_ray);
    auVar244._0_8_ = SVar283.values.values._8_8_;
    auVar244._8_56_ = auVar152;
    auVar146._0_8_ = SVar283.values.values._0_8_;
    auVar146._8_56_ = auVar249;
    auVar48 = vmovlhps_avx(auVar146._0_16_,auVar244._0_16_);
    auVar249 = ZEXT856(auVar48._8_8_);
    local_4b8._0_8_ = auVar48._0_8_;
    local_4b8._8_4_ = auVar48._8_4_;
    local_4b8._12_4_ = auVar48._12_4_;
    pLVar28 = pstd::optional<pbrt::LightLiSample>::value(&ls);
    SVar283 = SampledSpectrum::operator*((SampledSpectrum *)local_4b8,&pLVar28->L);
    auVar245._0_8_ = SVar283.values.values._8_8_;
    auVar245._8_56_ = auVar152;
    auVar147._0_8_ = SVar283.values.values._0_8_;
    auVar147._8_56_ = auVar249;
    si.optionalValue._0_16_ = vmovlhps_avx(auVar147._0_16_,auVar245._0_16_);
    auVar249 = ZEXT856(si.optionalValue._8_8_);
    SVar283 = SampledSpectrum::operator+(&lightPathPDF,&uniPathPDF);
    auVar246._0_8_ = SVar283.values.values._8_8_;
    auVar246._8_56_ = auVar152;
    auVar148._0_8_ = SVar283.values.values._0_8_;
    auVar148._8_56_ = auVar249;
    auVar48 = vmovlhps_avx(auVar148._0_16_,auVar246._0_16_);
    local_600._0_8_ = auVar48._0_8_;
    local_600._8_4_ = auVar48._8_4_;
    fStack_5f4 = auVar48._12_4_;
    FVar50 = SampledSpectrum::Average((SampledSpectrum *)local_600);
    auVar249 = extraout_var_02;
    SVar283 = SampledSpectrum::operator/((SampledSpectrum *)&si,FVar50);
    auVar247._0_8_ = SVar283.values.values._8_8_;
    auVar247._8_56_ = auVar152;
    auVar252 = auVar247._0_16_;
    auVar149._0_8_ = SVar283.values.values._0_8_;
    auVar149._8_56_ = auVar249;
    auVar48 = auVar149._0_16_;
  }
  local_360.values.values = (array<float,_4>)vmovlhps_avx(auVar48,auVar252);
LAB_004186ec:
  pstd::optional<pbrt::LightLiSample>::~optional(&ls);
LAB_0041870c:
  pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
  return (array<float,_4>)(array<float,_4>)local_360;
}

Assistant:

SampledSpectrum VolPathIntegrator::SampleLd(const Interaction &intr, const BSDF *bsdf,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            const SampledSpectrum &T_hat,
                                            const SampledSpectrum &pathPDF) const {
    // Estimate light-sampled direct illumination at _intr_
    // Initialize _LightSampleContext_ for volumetric light sampling
    LightSampleContext ctx;
    if (bsdf) {
        ctx = LightSampleContext(intr.AsSurface());
        // Try to nudge the light sampling position to correct side of the surface
        if (bsdf->HasReflection() && !bsdf->HasTransmission())
            ctx.pi = intr.OffsetRayOrigin(intr.wo);
        else if (bsdf->HasTransmission() && !bsdf->HasReflection())
            ctx.pi = intr.OffsetRayOrigin(-intr.wo);

    } else
        ctx = LightSampleContext(intr);

    // Sample a light source using _lightSampler_
    Float u = sampler.Get1D();
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(ctx, u);
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return SampledSpectrum(0.f);
    LightHandle light = sampledLight->light;
    CHECK(light != nullptr && sampledLight->pdf != 0);

    // Sample a point on the light source
    pstd::optional<LightLiSample> ls =
        light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls->L || ls->pdf == 0)
        return SampledSpectrum(0.f);
    Float lightPDF = sampledLight->pdf * ls->pdf;

    // Evaluate BSDF or phase function for light sample direction
    Float scatterPDF;
    SampledSpectrum f_hat;
    Vector3f wo = intr.wo, wi = ls->wi;
    if (bsdf) {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the BSDF
        f_hat = bsdf->f(wo, wi) * AbsDot(wi, intr.AsSurface().shading.n);
        scatterPDF = bsdf->PDF(wo, wi);

    } else {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the phase function
        CHECK(intr.IsMediumInteraction());
        PhaseFunctionHandle phase = intr.AsMedium().phase;
        f_hat = SampledSpectrum(phase.p(wo, wi));
        scatterPDF = phase.PDF(wo, wi);
    }
    if (!f_hat)
        return SampledSpectrum(0.f);

    // Declare path state variables for ray to light source
    Ray lightRay = intr.SpawnRayTo(ls->pLight);
    SampledSpectrum T_ray(1.f), lightPathPDF(1.f), uniPathPDF(1.f);
    RNG rng(Hash(lightRay.o), Hash(lightRay.d));

    while (lightRay.d != Vector3f(0, 0, 0)) {
        // Trace ray through media to estimate transmittance
        pstd::optional<ShapeIntersection> si = Intersect(lightRay, 1 - ShadowEpsilon);
        // Handle opaque surface along ray's path
        if (si && si->intr.material)
            return SampledSpectrum(0.f);

        // Update transmittance for current ray segment
        if (lightRay.medium != nullptr) {
            Float tMax = si ? si->tHit : (1 - ShadowEpsilon);
            SampledSpectrum Tmaj = lightRay.medium.SampleTmaj(
                lightRay, tMax, rng.Uniform<Float>(), rng, lambda,
                [&](const MediumSample &mediumSample) {
                    // Update ray transmittance estimate at sampled point
                    // Update _T_ray_ and PDFs using ratio-tracking estimator
                    const MediumInteraction &intr = mediumSample.intr;
                    SampledSpectrum Tmaj = mediumSample.Tmaj, sigma_n = intr.sigma_n();
                    T_ray *= Tmaj * sigma_n;
                    lightPathPDF *= Tmaj * intr.sigma_maj;
                    uniPathPDF *= Tmaj * sigma_n;

                    // Possibly terminate transmittance computation using Russian roulette
                    SampledSpectrum Tr = T_ray / (lightPathPDF + uniPathPDF).Average();
                    if (Tr.MaxComponentValue() < 0.05f) {
                        Float q = 0.75f;
                        if (rng.Uniform<Float>() < q)
                            T_ray = SampledSpectrum(0.);
                        else {
                            lightPathPDF *= 1 - q;
                            uniPathPDF *= 1 - q;
                        }
                    }

                    if (!T_ray)
                        return false;
                    Rescale(T_ray, lightPathPDF, uniPathPDF);
                    return true;
                });
            // Update transmittance estimate for final unsampled segment
            T_ray *= Tmaj;
            lightPathPDF *= Tmaj;
            uniPathPDF *= Tmaj;
        }

        // Generate next ray segment or return final transmittance
        if (!T_ray)
            return SampledSpectrum(0.f);
        if (!si)
            break;
        lightRay = si->intr.SpawnRayTo(ls->pLight);
    }
    // Return path contribution function estimate for direct lighting
    lightPathPDF *= pathPDF * lightPDF;
    uniPathPDF *= pathPDF * scatterPDF;
    if (IsDeltaLight(light.Type()))
        return T_hat * f_hat * T_ray * ls->L / lightPathPDF.Average();
    else
        return T_hat * f_hat * T_ray * ls->L / (lightPathPDF + uniPathPDF).Average();
}